

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

bool __thiscall ImFontAtlas::Build(ImFontAtlas *this)

{
  ImBitVector *this_00;
  ImBitVector *this_01;
  undefined4 uVar1;
  ImVec2 IVar2;
  stbtt__point sVar3;
  undefined4 uVar5;
  undefined8 uVar4;
  byte bVar6;
  byte bVar7;
  ImWchar IVar8;
  ushort uVar9;
  undefined2 uVar10;
  ImFont *pIVar11;
  ImFont *pIVar12;
  undefined8 *puVar13;
  ImFontConfig *pIVar14;
  long lVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  stbtt__buf fontdict;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  stbtt__active_edge **ppsVar25;
  bool bVar26;
  ushort uVar27;
  stbtt_uint32 sVar28;
  stbtt_uint32 sVar33;
  uint uVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  undefined4 uVar38;
  ulong uVar39;
  stbtt_uint32 sVar29;
  stbtt_uint32 sVar30;
  stbtt_uint32 sVar31;
  stbtt_uint32 sVar32;
  void *pvVar40;
  int *piVar41;
  void *pvVar42;
  stbrp_context *ptr;
  uchar *puVar43;
  stbtt__buf *scanline;
  undefined1 auVar44 [8];
  undefined8 *puVar45;
  stbtt__active_edge *psVar46;
  stbtt__buf *psVar47;
  short sVar48;
  undefined4 uVar49;
  uint uVar50;
  ulong uVar51;
  ImWchar *pIVar52;
  long lVar53;
  stbtt__edge *psVar54;
  char *__function;
  int iVar55;
  size_t sVar56;
  ulong uVar57;
  long lVar58;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar59;
  long lVar60;
  size_t sVar61;
  stbtt_fontinfo *psVar62;
  ushort *puVar63;
  uchar uVar64;
  ulong uVar65;
  uint *ptr_00;
  stbrp_node **ppsVar66;
  byte *pbVar67;
  stbtt__edge *psVar68;
  uint uVar69;
  uint uVar70;
  ImFontConfig *pIVar71;
  byte *pbVar72;
  ImFontAtlas *atlas;
  uint uVar73;
  long lVar74;
  int iVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar88;
  float fVar89;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar90;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  float fVar92;
  float fVar93;
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 in_ZMM3 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [32];
  float fVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [32];
  float fVar116;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 in_ZMM5 [64];
  float fVar117;
  float fVar121;
  float fVar122;
  undefined1 auVar118 [16];
  float fVar123;
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar120 [32];
  float fVar128;
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar137;
  float fVar146;
  undefined1 auVar138 [32];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  undefined1 in_ZMM8 [64];
  undefined1 auVar139 [64];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  stbtt__buf sVar159;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  int in_stack_fffffffffffffb24;
  void *pvStack_4d0;
  undefined8 in_stack_fffffffffffffb40;
  uint uVar160;
  int iVar161;
  stbtt__point *psStack_4a8;
  float fStack_49c;
  undefined4 uStack_498;
  undefined2 uStack_494;
  undefined2 uStack_492;
  undefined2 uStack_490;
  undefined2 uStack_48e;
  undefined2 uStack_48c;
  undefined2 uStack_48a;
  stbrp_node *psStack_488;
  ImFontAtlas *pIStack_480;
  undefined1 auStack_478 [16];
  undefined1 auStack_460 [8];
  undefined1 auStack_458 [16];
  stbtt__edge *psStack_440;
  ulong uStack_438;
  int iStack_42c;
  ulong uStack_428;
  void *pvStack_420;
  stbtt__active_edge *psStack_418;
  undefined8 uStack_410;
  float fStack_404;
  float fStack_400;
  uint uStack_3fc;
  undefined1 auStack_3f8 [16];
  undefined1 auStack_3e8 [8];
  void *pvStack_3e0;
  stbtt__edge *psStack_3d0;
  float fStack_3c4;
  int iStack_3c0;
  float fStack_3bc;
  stbtt_fontinfo *psStack_3b8;
  undefined8 *puStack_3b0;
  long lStack_3a8;
  void *pvStack_3a0;
  uchar *puStack_398;
  stbtt__edge *psStack_390;
  ulong uStack_388;
  long lStack_380;
  float *pfStack_378;
  ulong uStack_370;
  float fStack_364;
  uint uStack_360;
  uint uStack_35c;
  float fStack_358;
  int iStack_354;
  uint uStack_350;
  undefined1 auStack_34c [20];
  stbrp_context *psStack_338;
  long lStack_330;
  float *pfStack_328;
  long lStack_320;
  long lStack_318;
  ulong uStack_310;
  ulong uStack_308;
  ulong uStack_300;
  undefined1 auStack_2f8 [16];
  size_t sStack_2e8;
  ImFontConfig *pIStack_2e0;
  long lStack_2d8;
  size_t sStack_2d0;
  size_t sStack_2c8;
  uchar *puStack_2c0;
  undefined4 *puStack_2b8;
  int iStack_2b0;
  int iStack_2ac;
  undefined1 auStack_2a8 [16];
  undefined1 auStack_298 [16];
  undefined2 uStack_288;
  undefined2 uStack_286;
  undefined2 uStack_284;
  undefined2 uStack_282;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 uStack_278;
  undefined2 uStack_276;
  undefined2 uStack_274;
  undefined2 uStack_272;
  undefined2 uStack_270;
  undefined2 uStack_26e;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  undefined1 auStack_268 [16];
  undefined1 auStack_258 [16];
  undefined8 uStack_248;
  undefined8 uStack_240;
  stbtt__buf asStack_238 [32];
  undefined1 auVar119 [32];
  
  auStack_3f8._8_8_ = auStack_3f8._0_8_;
  if (this->Locked == true) {
    __assert_fail("!Locked && \"Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x817,"bool ImFontAtlas::Build()");
  }
  if (this->FontBuilderIO != (ImFontBuilderIO *)0x0) {
    bVar26 = (*this->FontBuilderIO->FontBuilder_Build)(this);
    return bVar26;
  }
  ImFontAtlasGetBuilderForStbTruetype::io.FontBuilder_Build = ImFontAtlasBuildWithStbTruetype;
  if ((this->ConfigData).Size < 1) {
    __assert_fail("atlas->ConfigData.Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                  ,0x867,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
  }
  ImFontAtlasBuildInit(this);
  this->TexID = (ImTextureID)0x0;
  this->TexWidth = 0;
  this->TexHeight = 0;
  (this->TexUvScale).x = 0.0;
  (this->TexUvScale).y = 0.0;
  pvStack_4d0 = (void *)0x0;
  (this->TexUvWhitePixel).x = 0.0;
  (this->TexUvWhitePixel).y = 0.0;
  ClearTexData(this);
  uVar160 = (this->ConfigData).Size;
  iVar161 = (int)uVar160 >> 0x1f;
  if (0 < (int)uVar160) {
    uVar39 = 8;
    if (8 < uVar160) {
      uVar39 = (ulong)uVar160;
    }
    pvStack_4d0 = ImGui::MemAlloc(uVar39 * 0x110);
  }
  uVar34 = (this->Fonts).Size;
  auStack_3f8._0_8_ = (long)(int)uVar34;
  if ((long)(int)uVar34 < 1) {
    pvVar40 = (void *)0x0;
  }
  else {
    uVar39 = 8;
    if (8 < uVar34) {
      uVar39 = (ulong)uVar34;
    }
    pvVar40 = ImGui::MemAlloc(uVar39 << 5);
  }
  sStack_2e8 = CONCAT44(iVar161,uVar160) * 0x110;
  memset(pvStack_4d0,0,sStack_2e8);
  sVar56 = auStack_3f8._0_8_ << 5;
  uStack_498._0_2_ = SUB82(pvVar40,0);
  uStack_498._2_2_ = (undefined2)((ulong)pvVar40 >> 0x10);
  uStack_494 = (undefined2)((ulong)pvVar40 >> 0x20);
  uStack_492 = (undefined2)((ulong)pvVar40 >> 0x30);
  memset(pvVar40,0,sVar56);
  pIStack_480 = this;
  if (0 < (this->ConfigData).Size) {
    uStack_370 = 0;
    if (0 < (int)uVar160) {
      uStack_370 = (ulong)uVar160;
    }
    uVar39 = 0;
    do {
      if (uVar39 == uStack_370) {
        __function = "T &ImVector<ImFontBuildSrcData>::operator[](int) [T = ImFontBuildSrcData]";
        goto LAB_0018e715;
      }
      pIVar71 = (pIStack_480->ConfigData).Data;
      pIVar11 = pIVar71[uVar39].DstFont;
      if ((pIVar11 == (ImFont *)0x0) ||
         (pIVar11->ContainerAtlas != pIStack_480 && pIVar11->ContainerAtlas != (ImFontAtlas *)0x0))
      {
        __assert_fail("cfg.DstFont && (!cfg.DstFont->IsLoaded() || cfg.DstFont->ContainerAtlas == atlas)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x87f,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(undefined4 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe0) = 0xffffffff;
      uVar51 = (ulong)(pIStack_480->Fonts).Size;
      if ((long)uVar51 < 1) {
LAB_0018e760:
        __assert_fail("src_tmp.DstIndex != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x888,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      pIVar71 = pIVar71 + uVar39;
      uVar57 = 0;
      while (pIVar12 = (pIStack_480->Fonts).Data[uVar57], pIVar11 != pIVar12) {
        uVar57 = uVar57 + 1;
        if ((uVar51 <= uVar57) || (pIVar11 == pIVar12)) goto LAB_0018e760;
      }
      *(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe0) = (int)uVar57;
      pbVar72 = (byte *)pIVar71->FontData;
      iVar55 = pIVar71->FontNo;
      bVar6 = *pbVar72;
      auStack_458._0_8_ = pIVar71;
      if (bVar6 < 0x4f) {
        if (bVar6 == 0) {
          if (pbVar72[1] != 1) goto LAB_0018e7f6;
        }
        else if ((bVar6 != 0x31) || (pbVar72[1] != 0)) goto LAB_0018e7f6;
        if ((pbVar72[2] != 0) || (pbVar72[3] != 0)) goto LAB_0018e7f6;
LAB_0018b60a:
        sVar33 = -(uint)(iVar55 != 0);
      }
      else {
        if (bVar6 == 0x4f) {
          if (((pbVar72[1] != 0x54) || (pbVar72[2] != 0x54)) || (pbVar72[3] != 0x4f))
          goto LAB_0018e7f6;
          goto LAB_0018b60a;
        }
        if (bVar6 != 0x74) goto LAB_0018e7f6;
        bVar6 = pbVar72[1];
        if (bVar6 == 0x72) {
          if ((pbVar72[2] != 0x75) || (pbVar72[3] != 0x65)) goto LAB_0018e7f6;
          goto LAB_0018b60a;
        }
        if (bVar6 != 0x74) {
          if (((bVar6 != 0x79) || (pbVar72[2] != 0x70)) || (pbVar72[3] != 0x31)) goto LAB_0018e7f6;
          goto LAB_0018b60a;
        }
        if ((pbVar72[2] != 99) || (pbVar72[3] != 0x66)) goto LAB_0018e7f6;
        uVar34 = *(uint *)(pbVar72 + 4);
        uVar34 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 | uVar34 << 0x18
        ;
        if (((uVar34 != 0x20000) && (uVar34 != 0x10000)) ||
           (uVar34 = *(uint *)(pbVar72 + 8),
           (int)(uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 | uVar34 << 0x18
                ) <= iVar55)) goto LAB_0018e7f6;
        uVar34 = *(uint *)(pbVar72 + (long)iVar55 * 4 + 0xc);
        sVar33 = uVar34 >> 0x18 | (uVar34 & 0xff0000) >> 8 | (uVar34 & 0xff00) << 8 | uVar34 << 0x18
        ;
      }
      if ((int)sVar33 < 0) {
LAB_0018e7f6:
        __assert_fail("font_offset >= 0 && \"FontData is incorrect, or FontNo cannot be found.\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                      ,0x88d,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
      }
      *(byte **)((long)pvStack_4d0 + uVar39 * 0x110 + 8) = pbVar72;
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x10) = sVar33;
      *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x40) = 0;
      *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x48) = 0;
      sVar28 = stbtt__find_table(pbVar72,sVar33,"cmap");
      sVar29 = stbtt__find_table(pbVar72,sVar33,"loca");
      auStack_34c._4_4_ = sVar29;
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x18) = sVar29;
      sVar29 = stbtt__find_table(pbVar72,sVar33,"head");
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x1c) = sVar29;
      sVar30 = stbtt__find_table(pbVar72,sVar33,"glyf");
      auStack_478._0_4_ = sVar30;
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x20) = sVar30;
      sVar30 = stbtt__find_table(pbVar72,sVar33,"hhea");
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x24) = sVar30;
      sVar31 = stbtt__find_table(pbVar72,sVar33,"hmtx");
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x28) = sVar31;
      sVar32 = stbtt__find_table(pbVar72,sVar33,"kern");
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x2c) = sVar32;
      sVar32 = stbtt__find_table(pbVar72,sVar33,"GPOS");
      auVar79 = in_ZMM8._0_16_;
      auVar95 = in_ZMM5._0_16_;
      auVar80 = in_ZMM3._0_16_;
      *(stbtt_uint32 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x30) = sVar32;
      if ((((sVar28 == 0) || (sVar29 == 0)) || (sVar30 == 0)) || (sVar31 == 0)) {
LAB_0018be2a:
        pvVar40 = (void *)CONCAT26(uStack_492,
                                   CONCAT24(uStack_494,
                                            CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
        if (pvVar40 != (void *)0x0) {
          ImGui::MemFree(pvVar40);
        }
        bVar26 = false;
        goto LAB_0018e680;
      }
      if (auStack_478._0_4_ == 0) {
        lStack_3a8 = CONCAT44(lStack_3a8._4_4_,2);
        auStack_460 = (undefined1  [8])((ulong)auStack_460 & 0xffffffff00000000);
        uStack_410._0_4_ = 0;
        fStack_49c = 0.0;
        sVar29 = stbtt__find_table(pbVar72,sVar33,"CFF ");
        if (sVar29 != 0) {
          *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x80) = 0;
          *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x88) = 0;
          *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x90) = 0;
          *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x98) = 0;
          *(byte **)((long)pvStack_4d0 + uVar39 * 0x110 + 0x40) = pbVar72 + sVar29;
          *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x48) = 0x2000000000000000;
          asStack_238[0].data = *(uchar **)((long)pvStack_4d0 + uVar39 * 0x110 + 0x40);
          asStack_238[0]._8_8_ = *(undefined8 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x48);
          if (asStack_238[0].cursor < -2) goto LAB_0018e8df;
          uVar34 = asStack_238[0].cursor + 2;
          if (asStack_238[0].size < (int)uVar34) goto LAB_0018e8df;
          uVar70 = 0;
          if ((int)uVar34 < asStack_238[0].size) {
            uVar70 = (uint)asStack_238[0].data[uVar34];
          }
          if (asStack_238[0].size < (int)uVar70) goto LAB_0018e8df;
          asStack_238[0].cursor = uVar70;
          in_ZMM3 = ZEXT1664(auVar80);
          in_ZMM5 = ZEXT1664(auVar95);
          in_ZMM8 = ZEXT1664(auVar79);
          stbtt__cff_get_index(asStack_238);
          sVar159 = stbtt__cff_get_index(asStack_238);
          _auStack_3e8 = stbtt__cff_index_get(sVar159,0);
          stbtt__cff_get_index(asStack_238);
          sVar159 = stbtt__cff_get_index(asStack_238);
          *(stbtt__buf *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x60) = sVar159;
          stbtt__dict_get_ints((stbtt__buf *)auStack_3e8,0x11,1,(stbtt_uint32 *)auStack_460);
          stbtt__dict_get_ints((stbtt__buf *)auStack_3e8,0x106,1,(stbtt_uint32 *)&lStack_3a8);
          stbtt__dict_get_ints((stbtt__buf *)auStack_3e8,0x124,1,(stbtt_uint32 *)&uStack_410);
          stbtt__dict_get_ints((stbtt__buf *)auStack_3e8,0x125,1,(stbtt_uint32 *)&fStack_49c);
          uVar59 = asStack_238[0]._8_8_;
          sVar159.data._4_4_ = in_stack_fffffffffffffb1c;
          sVar159.data._0_4_ = in_stack_fffffffffffffb18;
          sVar159.cursor = sVar33;
          sVar159.size = in_stack_fffffffffffffb24;
          fontdict.cursor = uVar160;
          fontdict.data = (uchar *)in_stack_fffffffffffffb40;
          fontdict.size = iVar161;
          sVar159 = stbtt__get_subrs(sVar159,fontdict);
          fVar76 = fStack_49c;
          *(stbtt__buf *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x70) = sVar159;
          if (((stbtt_uint32)lStack_3a8 == 2) &&
             (uVar38 = auStack_460._0_4_, auStack_460._0_4_ != 0)) {
            iVar55 = SUB84(uVar59,4);
            if ((stbtt_uint32)uStack_410 != 0) {
              uVar51 = (ulong)(uint)fStack_49c;
              if (uVar51 == 0) goto LAB_0018be2a;
              if (((int)(stbtt_uint32)uStack_410 < 0) ||
                 (SUB84(uVar59,4) < (int)(stbtt_uint32)uStack_410)) goto LAB_0018e8df;
              asStack_238[0].cursor = (stbtt_uint32)uStack_410;
              sVar159 = stbtt__cff_get_index(asStack_238);
              *(stbtt__buf *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x80) = sVar159;
              puVar43 = asStack_238[0].data + uVar51;
              lVar53 = (ulong)(uint)(asStack_238[0].size - (int)fVar76) << 0x20;
              if ((int)(asStack_238[0].size - (int)fVar76 | (uint)fVar76) < 0 ||
                  asStack_238[0].size < (int)fVar76) {
                puVar43 = (uchar *)0x0;
                lVar53 = 0;
              }
              *(uchar **)((long)pvStack_4d0 + uVar39 * 0x110 + 0x90) = puVar43;
              *(long *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x98) = lVar53;
              iVar55 = asStack_238[0].size;
            }
            if (((int)uVar38 < 0) || (iVar55 < (int)uVar38)) {
LAB_0018e8df:
              __assert_fail("!(o > b->size || o < 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                            ,0x46c,"void stbtt__buf_seek(stbtt__buf *, int)");
            }
            asStack_238[0].cursor = uVar38;
            sVar159 = stbtt__cff_get_index(asStack_238);
            *(stbtt__buf *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x50) = sVar159;
            goto LAB_0018b9b1;
          }
        }
        goto LAB_0018be2a;
      }
      if ((float)auStack_34c._4_4_ == 0.0) goto LAB_0018be2a;
LAB_0018b9b1:
      sVar33 = stbtt__find_table(pbVar72,sVar33,"maxp");
      if (sVar33 == 0) {
        uVar34 = 0xffff;
      }
      else {
        uVar34 = (uint)(ushort)(*(ushort *)(pbVar72 + (ulong)sVar33 + 4) << 8 |
                               *(ushort *)(pbVar72 + (ulong)sVar33 + 4) >> 8);
      }
      *(uint *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x14) = uVar34;
      uVar27 = *(ushort *)(pbVar72 + (ulong)sVar28 + 2) << 8 |
               *(ushort *)(pbVar72 + (ulong)sVar28 + 2) >> 8;
      *(undefined4 *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x34) = 0;
      if (uVar27 == 0) goto LAB_0018be2a;
      uVar34 = sVar28 + 4;
      uVar51 = (ulong)uVar27;
      iVar55 = 0;
      do {
        uVar27 = *(ushort *)(pbVar72 + uVar34) << 8 | *(ushort *)(pbVar72 + uVar34) >> 8;
        if ((uVar27 == 0) ||
           ((uVar27 == 3 &&
            ((uVar27 = *(ushort *)(pbVar72 + (ulong)uVar34 + 2) << 8 |
                       *(ushort *)(pbVar72 + (ulong)uVar34 + 2) >> 8, uVar27 == 10 || (uVar27 == 1))
            )))) {
          uVar70 = *(uint *)(pbVar72 + (ulong)uVar34 + 4);
          iVar55 = (uVar70 >> 0x18 | (uVar70 & 0xff0000) >> 8 | (uVar70 & 0xff00) << 8 |
                   uVar70 << 0x18) + sVar28;
          *(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x34) = iVar55;
        }
        uVar34 = uVar34 + 8;
        uVar51 = uVar51 - 1;
      } while (uVar51 != 0);
      if (iVar55 == 0) goto LAB_0018be2a;
      *(uint *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x38) =
           (uint)(ushort)(*(ushort *)
                           (pbVar72 +
                           (long)*(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x1c) + 0x32) << 8 |
                         *(ushort *)
                          (pbVar72 +
                          (long)*(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0x1c) + 0x32) >> 8);
      iVar55 = *(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe0);
      if (((long)iVar55 < 0) || ((int)auStack_3f8._0_4_ <= iVar55)) goto LAB_0018e853;
      pIVar52 = *(ImWchar **)(auStack_458._0_8_ + 0x38);
      if (pIVar52 == (ImWchar *)0x0) {
        pIVar52 = GetGlyphRangesDefault::ranges;
      }
      *(ImWchar **)((long)pvStack_4d0 + uVar39 * 0x110 + 0xd8) = pIVar52;
      IVar8 = *pIVar52;
      while (IVar8 != 0) {
        uVar27 = pIVar52[1];
        if (uVar27 == 0) break;
        uVar34 = *(uint *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe4);
        uVar70 = (uint)uVar27;
        if ((int)(uint)uVar27 < (int)uVar34) {
          uVar70 = uVar34;
        }
        *(uint *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe4) = uVar70;
        IVar8 = pIVar52[2];
        pIVar52 = pIVar52 + 2;
      }
      piVar41 = (int *)((long)iVar55 * 0x20 +
                       CONCAT26(uStack_492,
                                CONCAT24(uStack_494,
                                         CONCAT22(uStack_498._2_2_,(undefined2)uStack_498))));
      *piVar41 = *piVar41 + 1;
      iVar55 = *(int *)((long)pvStack_4d0 + uVar39 * 0x110 + 0xe4);
      if (iVar55 < piVar41[1]) {
        iVar55 = piVar41[1];
      }
      piVar41[1] = iVar55;
      uVar39 = uVar39 + 1;
    } while ((long)uVar39 < (long)(pIStack_480->ConfigData).Size);
  }
  uVar34 = 0;
  if (0 < (int)uVar160) {
    lVar53 = 0;
    uVar34 = 0;
    do {
      lVar74 = lVar53 * 0x110;
      iVar55 = *(int *)((long)pvStack_4d0 + lVar74 + 0xe0);
      if (((long)iVar55 < 0) || ((int)auStack_3f8._0_4_ <= iVar55)) goto LAB_0018e853;
      this_01 = (ImBitVector *)((long)pvStack_4d0 + lVar74 + 0xf0);
      ImBitVector::Create(this_01,*(int *)((long)pvStack_4d0 + lVar74 + 0xe4) + 1);
      lVar60 = (long)iVar55 * 0x20 +
               CONCAT26(uStack_492,
                        CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
      this_00 = (ImBitVector *)(lVar60 + 0x10);
      if (*(int *)(lVar60 + 0x10) == 0) {
        ImBitVector::Create(this_00,*(int *)(lVar60 + 4) + 1);
      }
      puVar63 = *(ushort **)((long)pvStack_4d0 + lVar74 + 0xd8);
      uVar27 = *puVar63;
      for (; (uVar27 != 0 && (puVar63[1] != 0)); puVar63 = puVar63 + 2) {
        if (uVar27 <= puVar63[1]) {
          uVar70 = (uint)uVar27;
          do {
            bVar26 = ImBitVector::TestBit(this_00,uVar70);
            if ((!bVar26) &&
               (iVar55 = stbtt_FindGlyphIndex
                                   (*(stbtt_fontinfo **)((long)pvStack_4d0 + lVar74 + 8),
                                    *(int *)((long)pvStack_4d0 + lVar74 + 0x34)), iVar55 != 0)) {
              piVar41 = (int *)((long)pvStack_4d0 + lVar74 + 0xe8);
              *piVar41 = *piVar41 + 1;
              *(int *)(lVar60 + 8) = *(int *)(lVar60 + 8) + 1;
              ImBitVector::SetBit(this_01,uVar70);
              ImBitVector::SetBit(this_00,uVar70);
              uVar34 = uVar34 + 1;
            }
            bVar26 = uVar70 < puVar63[1];
            uVar70 = uVar70 + 1;
          } while (bVar26);
        }
        uVar27 = puVar63[2];
      }
      lVar53 = lVar53 + 1;
    } while (lVar53 != CONCAT44(iVar161,uVar160));
    if (0 < (int)uVar160) {
      lVar53 = 0;
      do {
        lVar74 = lVar53 * 0x110;
        iVar55 = *(int *)((long)pvStack_4d0 + lVar74 + 0xe8);
        if (*(int *)((long)pvStack_4d0 + lVar74 + 0x104) < iVar55) {
          pvVar42 = ImGui::MemAlloc((long)iVar55 << 2);
          pvVar40 = *(void **)((long)pvStack_4d0 + lVar74 + 0x108);
          if (pvVar40 != (void *)0x0) {
            memcpy(pvVar42,pvVar40,(long)*(int *)((long)pvStack_4d0 + lVar74 + 0x100) << 2);
            ImGui::MemFree(*(void **)((long)pvStack_4d0 + lVar74 + 0x108));
          }
          *(void **)((long)pvStack_4d0 + lVar74 + 0x108) = pvVar42;
          *(int *)((long)pvStack_4d0 + lVar74 + 0x104) = iVar55;
        }
        lVar60 = (long)*(int *)((long)pvStack_4d0 + lVar74 + 0xf0);
        ptr_00 = *(uint **)((long)pvStack_4d0 + lVar74 + 0xf8);
        if (0 < lVar60) {
          auStack_478._0_8_ = ptr_00 + lVar60;
          iVar55 = 0;
          do {
            uVar70 = *ptr_00;
            if (uVar70 != 0) {
              uVar73 = 0;
              do {
                if ((uVar70 >> (uVar73 & 0x1f) & 1) != 0) {
                  iVar37 = *(int *)((long)pvStack_4d0 + lVar74 + 0x100);
                  if (iVar37 == *(int *)((long)pvStack_4d0 + lVar74 + 0x104)) {
                    if (iVar37 == 0) {
                      iVar35 = 8;
                    }
                    else {
                      iVar35 = iVar37 / 2 + iVar37;
                    }
                    iVar75 = iVar37 + 1;
                    if (iVar37 + 1 < iVar35) {
                      iVar75 = iVar35;
                    }
                    pvVar40 = ImGui::MemAlloc((long)iVar75 << 2);
                    pvVar42 = *(void **)((long)pvStack_4d0 + lVar74 + 0x108);
                    if (pvVar42 != (void *)0x0) {
                      memcpy(pvVar40,pvVar42,(long)*(int *)((long)pvStack_4d0 + lVar74 + 0x100) << 2
                            );
                      ImGui::MemFree(*(void **)((long)pvStack_4d0 + lVar74 + 0x108));
                    }
                    *(void **)((long)pvStack_4d0 + lVar74 + 0x108) = pvVar40;
                    *(int *)((long)pvStack_4d0 + lVar74 + 0x104) = iVar75;
                    iVar37 = *(int *)((long)pvStack_4d0 + lVar74 + 0x100);
                  }
                  else {
                    pvVar40 = *(void **)((long)pvStack_4d0 + lVar74 + 0x108);
                  }
                  *(uint *)((long)pvVar40 + (long)iVar37 * 4) = iVar55 + uVar73;
                  piVar41 = (int *)((long)pvStack_4d0 + lVar74 + 0x100);
                  *piVar41 = *piVar41 + 1;
                }
                uVar73 = uVar73 + 1;
              } while (uVar73 != 0x20);
            }
            ptr_00 = ptr_00 + 1;
            iVar55 = iVar55 + 0x20;
          } while (ptr_00 < (ulong)auStack_478._0_8_);
          ptr_00 = *(uint **)((long)pvStack_4d0 + lVar74 + 0xf8);
        }
        if (ptr_00 != (uint *)0x0) {
          *(undefined8 *)((long)pvStack_4d0 + lVar74 + 0xf0) = 0;
          ImGui::MemFree(ptr_00);
          *(undefined8 *)((long)pvStack_4d0 + lVar74 + 0xf8) = 0;
        }
        if (*(int *)((long)pvStack_4d0 + lVar74 + 0x100) !=
            *(int *)((long)pvStack_4d0 + lVar74 + 0xe8)) {
          __assert_fail("src_tmp.GlyphsList.Size == src_tmp.GlyphsCount",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                        ,0x8bc,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
        }
        lVar53 = lVar53 + 1;
      } while (lVar53 != CONCAT44(iVar161,uVar160));
    }
  }
  atlas = pIStack_480;
  if ((int)auStack_3f8._0_4_ < 1) {
    if (CONCAT26(uStack_492,CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)))
        == 0) goto LAB_0018be96;
  }
  else {
    sVar61 = 0;
    lVar53 = CONCAT26(uStack_492,
                      CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
    do {
      pvVar40 = *(void **)(lVar53 + 0x18 + sVar61);
      if (pvVar40 != (void *)0x0) {
        *(undefined8 *)(lVar53 + 0x10 + sVar61) = 0;
        ImGui::MemFree(pvVar40);
        *(undefined8 *)(lVar53 + 0x18 + sVar61) = 0;
      }
      sVar61 = sVar61 + 0x20;
    } while (sVar56 != sVar61);
  }
  ImGui::MemFree((void *)CONCAT26(uStack_492,
                                  CONCAT24(uStack_494,
                                           CONCAT22(uStack_498._2_2_,(undefined2)uStack_498))));
LAB_0018be96:
  _auStack_3e8 = (stbtt__buf)ZEXT816(0);
  lStack_3a8 = 0;
  pvStack_3a0 = (void *)0x0;
  if ((int)uVar34 < 1) {
    auStack_3e8._0_4_ = uVar34;
    pvVar40 = (void *)0x0;
  }
  else {
    uVar39 = 8;
    if (8 < uVar34) {
      uVar39 = (ulong)uVar34;
    }
    pvVar40 = ImGui::MemAlloc(uVar39 << 4);
    pvStack_3e0 = pvVar40;
    auStack_3e8._4_4_ = (int)uVar39;
    uVar39 = 8;
    if (8 < uVar34) {
      uVar39 = (ulong)uVar34;
    }
    auStack_3e8._0_4_ = uVar34;
    pvStack_3a0 = ImGui::MemAlloc(uVar39 * 0x1c);
    lStack_3a8 = uVar39 << 0x20;
  }
  pvVar42 = pvStack_3a0;
  lStack_3a8 = CONCAT44(lStack_3a8._4_4_,uVar34);
  iVar55 = 0;
  memset(pvVar40,0,(long)(int)(uVar34 << 4));
  uStack_498._0_2_ = SUB82(pvVar42,0);
  uStack_498._2_2_ = (undefined2)((ulong)pvVar42 >> 0x10);
  uStack_494 = (undefined2)((ulong)pvVar42 >> 0x20);
  uStack_492 = (undefined2)((ulong)pvVar42 >> 0x30);
  memset(pvVar42,0,(long)(int)(uVar34 * 0x1c));
  auVar95 = in_ZMM8._0_16_;
  auVar80 = in_ZMM5._0_16_;
  auVar102 = in_ZMM3._0_32_;
  if ((int)uVar160 < 1) {
    auVar79 = ZEXT816(0) << 0x40;
  }
  else {
    auStack_458._8_4_ = 0x80000000;
    auStack_458._0_8_ = 0x8000000080000000;
    auStack_458._12_4_ = 0x80000000;
    lVar74 = 0;
    uVar39 = 0;
    uVar70 = 0;
    lVar53 = CONCAT26(uStack_492,
                      CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
    uVar73 = uVar34;
    do {
      iVar35 = (int)uVar39;
      iVar37 = *(int *)((long)pvStack_4d0 + lVar74 * 0x110 + 0xe8);
      if (iVar37 != 0) {
        if ((iVar35 < 0) || ((int)uVar73 <= iVar35)) {
          __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
          goto LAB_0018e715;
        }
        psVar62 = (stbtt_fontinfo *)(lVar74 * 0x110 + (long)pvStack_4d0);
        *(void **)&psVar62[1].hmtx = (void *)(uVar39 * 0x10 + (long)pvVar40);
        if (((int)uVar70 < 0) || ((int)uVar73 <= (int)uVar70)) {
          __function = "T &ImVector<stbtt_packedchar>::operator[](int) [T = stbtt_packedchar]";
          goto LAB_0018e715;
        }
        lVar60 = (ulong)uVar70 * 0x1c + lVar53;
        *(long *)&psVar62[1].gpos = lVar60;
        if ((atlas->ConfigData).Size <= lVar74) goto LAB_0018e7bd;
        pIVar71 = (atlas->ConfigData).Data;
        fVar76 = pIVar71[lVar74].SizePixels;
        *(float *)&psVar62[1].userdata = fVar76;
        *(undefined4 *)((long)&psVar62[1].userdata + 4) = 0;
        psVar62[1].data = *(uchar **)&psVar62[1].gsubrs.cursor;
        uVar50 = *(uint *)&psVar62[1].gsubrs.data;
        uVar51 = (ulong)uVar50;
        psVar62[1].fontstart = uVar50;
        *(long *)&psVar62[1].loca = lVar60;
        *(char *)&psVar62[1].glyf = (char)pIVar71[lVar74].OversampleH;
        *(char *)((long)&psVar62[1].glyf + 1) = (char)pIVar71[lVar74].OversampleV;
        if (fVar76 <= 0.0) {
          fVar76 = (float)((uint)fVar76 ^ auStack_458._0_4_);
          uVar69 = (uint)(ushort)(*(ushort *)(psVar62->data + (long)psVar62->head + 0x12) << 8 |
                                 *(ushort *)(psVar62->data + (long)psVar62->head + 0x12) >> 8);
        }
        else {
          puVar43 = psVar62->data;
          lVar60 = (long)psVar62->hhea;
          auStack_478._0_4_ = uVar70;
          lVar53 = CONCAT26(uStack_492,
                            CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
          uVar69 = ((int)(short)((ushort)puVar43[lVar60 + 4] << 8) | (uint)puVar43[lVar60 + 5]) -
                   ((int)(short)((ushort)puVar43[lVar60 + 6] << 8) | (uint)puVar43[lVar60 + 7]);
        }
        fVar76 = fVar76 / (float)(int)uVar69;
        uVar39 = (ulong)(uint)(iVar35 + iVar37);
        uVar70 = uVar70 + iVar37;
        if (0 < (int)uVar50) {
          auStack_478._0_4_ = uVar70;
          auStack_3f8._0_8_ = lVar74;
          iVar75 = atlas->TexGlyphPadding;
          lVar60 = 6;
          lVar53 = 0;
          do {
            if ((int)uVar51 <= lVar53) goto LAB_0018e700;
            iVar36 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar62->data,psVar62->index_map);
            if (iVar36 == 0) {
              __assert_fail("glyph_index_in_font != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_draw.cpp"
                            ,0x8eb,"bool ImFontAtlasBuildWithStbTruetype(ImFontAtlas *)");
            }
            stbtt_GetGlyphBitmapBoxSubpixel
                      (psVar62,iVar36,fVar76 * (float)pIVar71[lVar74].OversampleH,
                       fVar76 * (float)pIVar71[lVar74].OversampleV,fVar76,in_ZMM3._0_4_,
                       (int *)asStack_238,(int *)auStack_460,(int *)&uStack_410,(int *)&fStack_49c);
            uVar70 = (pIVar71[lVar74].OversampleH +
                     (((stbtt_uint32)uStack_410 + iVar75) - (int)asStack_238[0].data)) - 1;
            lVar58 = *(long *)&psVar62[1].hmtx;
            *(short *)(lVar58 + -2 + lVar60) = (short)uVar70;
            uVar73 = (pIVar71[lVar74].OversampleV + (((int)fStack_49c + iVar75) - auStack_460._0_4_)
                     ) - 1;
            *(short *)(lVar58 + lVar60) = (short)uVar73;
            iVar55 = iVar55 + (uVar73 & 0xffff) * (uVar70 & 0xffff);
            lVar53 = lVar53 + 1;
            uVar51 = (ulong)*(int *)&psVar62[1].gsubrs.data;
            lVar60 = lVar60 + 0x10;
          } while (lVar53 < (long)uVar51);
          lVar53 = CONCAT26(uStack_492,
                            CONCAT24(uStack_494,CONCAT22(uStack_498._2_2_,(undefined2)uStack_498)));
          uVar39 = (ulong)(uint)(iVar35 + iVar37);
          lVar74 = auStack_3f8._0_8_;
          atlas = pIStack_480;
          uVar70 = auStack_478._0_4_;
          uVar73 = uVar34;
        }
      }
      auVar95 = in_ZMM8._0_16_;
      auVar80 = in_ZMM5._0_16_;
      auVar102 = in_ZMM3._0_32_;
      lVar74 = lVar74 + 1;
    } while (lVar74 != CONCAT44(iVar161,uVar160));
    auVar79._0_4_ = (float)iVar55;
    auVar79._4_12_ = in_ZMM3._4_12_;
  }
  atlas->TexHeight = 0;
  iVar55 = atlas->TexDesiredWidth;
  if (iVar55 < 1) {
    auVar79 = vsqrtss_avx(auVar79,auVar79);
    iVar37 = (int)auVar79._0_4_;
    iVar55 = 0x1000;
    if ((iVar37 < 0xb33) && (iVar55 = 0x800, iVar37 < 0x599)) {
      iVar55 = (uint)(0x2cb < iVar37) * 0x200 + 0x200;
    }
  }
  atlas->TexWidth = iVar55;
  iVar37 = atlas->TexGlyphPadding;
  ptr = (stbrp_context *)ImGui::MemAlloc(0x48);
  iVar35 = iVar55 - iVar37;
  psStack_488 = (stbrp_node *)ImGui::MemAlloc((long)iVar35 << 4);
  if ((ptr == (stbrp_context *)0x0) || (psStack_488 == (stbrp_node *)0x0)) {
    if (ptr != (stbrp_context *)0x0) {
      ImGui::MemFree(ptr);
    }
    if (psStack_488 != (stbrp_node *)0x0) {
      ImGui::MemFree(psStack_488);
    }
    psStack_488 = (stbrp_node *)0x0;
    iVar37 = 0;
    iVar55 = 0;
    ptr = (stbrp_context *)0x0;
  }
  else {
    if ((iVar37 < -0x7fff) || (0xffff < iVar35)) {
      __assert_fail("width <= 0xffff && height <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_rectpack.h"
                    ,0x10a,"void stbrp_init_target(stbrp_context *, int, int, stbrp_node *, int)");
    }
    uVar39 = (ulong)(iVar35 - 1U);
    if (iVar35 < 2) {
      uVar39 = 0;
    }
    else {
      uVar51 = (ulong)(iVar35 + 2U & 0xfffffffc);
      lVar53 = uVar39 - 1;
      auVar118._8_8_ = lVar53;
      auVar118._0_8_ = lVar53;
      auVar119._16_8_ = lVar53;
      auVar119._0_16_ = auVar118;
      auVar119._24_8_ = lVar53;
      ppsVar66 = &psStack_488[3].next;
      auVar18 = vpmovsxbq_avx2(ZEXT416(0x3020100));
      auVar91._8_8_ = 0x8000000000000000;
      auVar91._0_8_ = 0x8000000000000000;
      auVar102 = vpcmpeqd_avx2(auVar102,auVar102);
      auVar107._8_8_ = 0x8000000000000000;
      auVar107._0_8_ = 0x8000000000000000;
      auVar107._16_8_ = 0x8000000000000000;
      auVar107._24_8_ = 0x8000000000000000;
      auVar80 = vpcmpeqd_avx(auVar80,auVar80);
      auVar103._8_8_ = 4;
      auVar103._0_8_ = 4;
      auVar103._16_8_ = 4;
      auVar103._24_8_ = 4;
      do {
        auVar95 = vpcmpgtq_avx(auVar18._0_16_ ^ auVar91,auVar118 ^ auVar91);
        auVar147 = vpsubq_avx2(auVar18,auVar102);
        if ((~auVar95._0_4_ & 1) != 0) {
          ppsVar66[-6] = psStack_488 + auVar147._0_8_;
        }
        auVar95 = vpcmpgtq_avx(auVar18._0_16_ ^ auVar91,auVar118 ^ auVar91);
        auVar95 = vpshufd_avx(auVar95,0xaa);
        if (((auVar95 ^ auVar80) >> 0x20 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          lVar53 = vpextrq_avx(auVar147._0_16_,1);
          ppsVar66[-4] = psStack_488 + lVar53;
        }
        auVar153 = vpcmpgtq_avx2(auVar18 ^ auVar107,auVar119 ^ auVar107);
        auVar152._8_8_ = auVar153._16_8_;
        auVar152._0_8_ = auVar153._16_8_;
        auVar95 = auVar147._16_16_;
        if (((auVar152 ^ auVar80) & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          ppsVar66[-2] = psStack_488 + auVar147._16_8_;
        }
        auVar79 = vpshufd_avx(auVar153._16_16_,0xaa);
        if (((auVar79 ^ auVar80) & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          lVar53 = vpextrq_avx(auVar95,1);
          *ppsVar66 = psStack_488 + lVar53;
        }
        auVar18 = vpaddq_avx2(auVar18,auVar103);
        ppsVar66 = ppsVar66 + 8;
        uVar51 = uVar51 - 4;
      } while (uVar51 != 0);
    }
    psStack_488[uVar39].next = (stbrp_node *)0x0;
    ptr->init_mode = 1;
    ptr->heuristic = 0;
    ptr->free_head = psStack_488;
    ptr->active_head = ptr->extra;
    ptr->width = iVar35;
    ptr->height = 0x8000 - iVar37;
    ptr->num_nodes = iVar35;
    ptr->align = (int)((iVar35 - 1U) + iVar35) / iVar35;
    ptr->extra[0].x = 0;
    ptr->extra[0].y = 0;
    ptr->extra[0].next = ptr->extra + 1;
    ptr->extra[1].x = (stbrp_coord)iVar35;
    ptr->extra[1].y = 0xffff;
    ptr->extra[1].next = (stbrp_node *)0x0;
  }
  auVar139 = ZEXT1664(auVar95);
  psStack_338 = ptr;
  ImFontAtlasBuildPackCustomRects(atlas,ptr);
  if (0 < (int)uVar160) {
    lVar53 = 0;
    do {
      lVar74 = lVar53 * 0x110;
      iVar35 = *(int *)((long)pvStack_4d0 + lVar74 + 0xe8);
      if (iVar35 != 0) {
        stbrp_pack_rects(psStack_338,*(stbrp_rect **)((long)pvStack_4d0 + lVar74 + 200),iVar35);
        lVar60 = (long)*(int *)((long)pvStack_4d0 + lVar74 + 0xe8);
        if (0 < lVar60) {
          lVar74 = *(long *)((long)pvStack_4d0 + lVar74 + 200);
          lVar58 = 0;
          do {
            if (*(int *)(lVar74 + 0xc + lVar58) != 0) {
              iVar35 = (uint)*(ushort *)(lVar74 + 6 + lVar58) +
                       (uint)*(ushort *)(lVar74 + 10 + lVar58);
              if (iVar35 < atlas->TexHeight) {
                iVar35 = atlas->TexHeight;
              }
              atlas->TexHeight = iVar35;
            }
            lVar58 = lVar58 + 0x10;
          } while (lVar60 * 0x10 != lVar58);
        }
      }
      lVar53 = lVar53 + 1;
    } while (lVar53 != CONCAT44(iVar161,uVar160));
  }
  uVar34 = atlas->TexHeight;
  if ((atlas->Flags & 1) == 0) {
    uVar34 = (int)(uVar34 - 1) >> 1 | uVar34 - 1;
    uVar34 = (int)uVar34 >> 2 | uVar34;
    uVar34 = (int)uVar34 >> 4 | uVar34;
    uVar34 = (int)uVar34 >> 8 | uVar34;
    uVar34 = (int)uVar34 >> 0x10 | uVar34;
  }
  iVar35 = uVar34 + 1;
  atlas->TexHeight = iVar35;
  auVar80 = vpinsrd_avx(ZEXT416((uint)atlas->TexWidth),iVar35,1);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar95._8_4_ = 0x3f800000;
  auVar95._0_8_ = 0x3f8000003f800000;
  auVar95._12_4_ = 0x3f800000;
  auVar80 = vdivps_avx(auVar95,auVar80);
  IVar2 = (ImVec2)vmovlps_avx(auVar80);
  atlas->TexUvScale = IVar2;
  puVar43 = (uchar *)ImGui::MemAlloc((long)(iVar35 * atlas->TexWidth));
  atlas->TexPixelsAlpha8 = puVar43;
  iStack_42c = iVar55;
  memset(puVar43,0,(long)atlas->TexHeight * (long)atlas->TexWidth);
  if (0 < (int)uVar160) {
    puStack_398 = atlas->TexPixelsAlpha8;
    lVar74 = (long)iStack_42c;
    uStack_278 = (undefined2)iVar37;
    uStack_276 = uStack_278;
    uStack_274 = uStack_278;
    uStack_272 = uStack_278;
    uStack_270 = uStack_278;
    uStack_26e = uStack_278;
    uStack_26c = uStack_278;
    uStack_26a = uStack_278;
    lVar53 = 0;
    uStack_288 = 1;
    uStack_286 = 1;
    uStack_284 = 1;
    uStack_282 = 1;
    uStack_280 = 1;
    uStack_27e = 1;
    uStack_27c = 1;
    uStack_27a = 1;
    auStack_2f8._8_4_ = 0x80000000;
    auStack_2f8._0_8_ = 0x8000000080000000;
    auStack_2f8._12_4_ = 0x80000000;
    do {
      if ((atlas->ConfigData).Size <= lVar53) goto LAB_0018e7bd;
      if (*(int *)((long)pvStack_4d0 + lVar53 * 0x110 + 0xe8) != 0) {
        lStack_330 = lVar53;
        psVar62 = (stbtt_fontinfo *)(lVar53 * 0x110 + (long)pvStack_4d0);
        fStack_404 = *(float *)&psVar62[1].userdata;
        if (fStack_404 <= 0.0) {
          fStack_404 = (float)((uint)fStack_404 ^ auStack_2f8._0_4_);
          uVar34 = (uint)(ushort)(*(ushort *)(psVar62->data + (long)psVar62->head + 0x12) << 8 |
                                 *(ushort *)(psVar62->data + (long)psVar62->head + 0x12) >> 8);
        }
        else {
          puVar43 = psVar62->data;
          lVar53 = (long)psVar62->hhea;
          uVar34 = ((int)(short)((ushort)puVar43[lVar53 + 4] << 8) | (uint)puVar43[lVar53 + 5]) -
                   ((int)(short)((ushort)puVar43[lVar53 + 6] << 8) | (uint)puVar43[lVar53 + 7]);
        }
        fStack_404 = fStack_404 / (float)(int)uVar34;
        pIStack_2e0 = (atlas->ConfigData).Data;
        iVar55 = psVar62[1].fontstart;
        if (0 < iVar55) {
          lVar53._0_4_ = psVar62[1].hmtx;
          lVar53._4_4_ = psVar62[1].kern;
          uVar39._0_4_ = psVar62[1].glyf;
          uVar39._4_4_ = psVar62[1].hhea;
          auVar80._8_8_ = 0;
          auVar80._0_8_ = uVar39;
          auVar91 = vpmovzxbw_avx(auVar80);
          auVar80 = vpmovzxbd_avx(auVar80);
          auVar80 = vcvtdq2ps_avx(auVar80);
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auStack_258 = vdivps_avx(auVar98,auVar80);
          auVar81._8_8_ = 0;
          auVar81._0_8_ = uVar39;
          auVar95 = vpcmpeqb_avx(auVar81,_DAT_001e30b0);
          auVar79 = vpmovsxbd_avx(auVar95);
          auVar22._2_2_ = uStack_286;
          auVar22._0_2_ = uStack_288;
          auVar22._4_2_ = uStack_284;
          auVar22._6_2_ = uStack_282;
          auVar22._8_2_ = uStack_280;
          auVar22._10_2_ = uStack_27e;
          auVar22._12_2_ = uStack_27c;
          auVar22._14_2_ = uStack_27a;
          auVar95 = vpsubw_avx(auVar22,auVar91);
          auVar95 = vpmovsxwd_avx(auVar95);
          auVar95 = vcvtdq2ps_avx(auVar95);
          fVar76 = auVar80._0_4_;
          auVar109._0_4_ = fVar76 + fVar76;
          auVar109._4_4_ = auVar80._4_4_ + auVar80._4_4_;
          auVar109._8_4_ = auVar80._8_4_ + auVar80._8_4_;
          auVar109._12_4_ = auVar80._12_4_ + auVar80._12_4_;
          auVar95 = vdivps_avx(auVar95,auVar109);
          auStack_268 = vpandn_avx(auVar79,auVar95);
          fVar76 = fStack_404 * fVar76;
          auVar80 = vmovshdup_avx(auVar80);
          fVar78 = fStack_404 * auVar80._0_4_;
          auVar80 = vminss_avx(ZEXT416((uint)fVar78),ZEXT416((uint)fVar76));
          auVar104 = ZEXT464(0x3eb33333);
          fVar92 = 0.35 / auVar80._0_4_;
          fStack_3bc = fVar92 * fVar92;
          uStack_300 = uVar39 & 0xff;
          uStack_308 = uVar39 >> 8 & 0xff;
          auStack_2a8 = ZEXT416((uint)fVar78);
          auVar82._0_4_ = (uint)fVar78 ^ auStack_2f8._0_4_;
          auVar82._4_4_ = auStack_2f8._4_4_;
          auVar82._8_4_ = auStack_2f8._8_4_;
          auVar82._12_4_ = auStack_2f8._12_4_;
          uVar34 = vpextrw_avx(auVar91,1);
          uStack_438 = (ulong)(auVar91._0_4_ & 0xffff);
          auStack_298 = ZEXT416((uint)fVar76);
          auVar80 = vunpcklps_avx(ZEXT416((uint)fVar76),auVar82);
          uStack_248 = auVar80._0_8_;
          uStack_240 = auVar80._0_8_;
          lVar60 = 0;
          lStack_320 = lVar53;
          psStack_3b8 = psVar62;
          do {
            if (((*(int *)(lVar53 + 0xc + lVar60 * 0x10) != 0) &&
                (lVar58 = lVar60 * 0x10 + lVar53, *(short *)(lVar58 + 4) != 0)) &&
               (*(short *)(lVar58 + 6) != 0)) {
              puStack_2b8 = (undefined4 *)(lVar60 * 0x1c + *(long *)&psVar62[1].loca);
              fVar78 = auVar104._0_4_;
              auVar139 = ZEXT1664(auVar139._0_16_);
              lStack_318 = lVar60;
              iVar37 = stbtt_FindGlyphIndex((stbtt_fontinfo *)psVar62->data,psVar62->index_map);
              fVar76 = (float)CONCAT22(uStack_276,uStack_278);
              auVar23._4_2_ = uStack_274;
              auVar23._0_4_ = fVar76;
              auVar23._6_2_ = uStack_272;
              auVar23._8_2_ = uStack_270;
              auVar23._10_2_ = uStack_26e;
              auVar23._12_2_ = uStack_26c;
              auVar23._14_2_ = uStack_26a;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *(ulong *)(lVar58 + 4);
              auVar95 = vpsubw_avx(auVar83,auVar23);
              auVar80 = vpaddw_avx(auVar83,auVar23);
              auVar80 = vpblendd_avx2(auVar95,auVar80,2);
              *(long *)(lVar58 + 4) = auVar80._0_8_;
              puVar43 = psVar62->data;
              uVar27 = *(ushort *)(puVar43 + (long)psVar62->hhea + 0x22) << 8 |
                       *(ushort *)(puVar43 + (long)psVar62->hhea + 0x22) >> 8;
              iVar55 = psVar62->hmtx;
              lVar53 = (ulong)uVar27 * 4 + (long)iVar55 + -4;
              lVar60 = (ulong)uVar27 * 4 + (long)iVar55 + -3;
              if (iVar37 < (int)(uint)uVar27) {
                lVar53 = (long)(iVar37 * 4) + (long)iVar55;
                lVar60 = (long)(iVar37 * 4) + 1 + (long)iVar55;
              }
              uStack_360 = (uint)puVar43[lVar60];
              uStack_35c = (uint)puVar43[lVar53];
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psVar62,iVar37,(float)auStack_298._0_4_,(float)auStack_2a8._0_4_,fVar76,
                         fVar78,(int *)&uStack_350,&iStack_354,&iStack_2ac,&iStack_2b0);
              uVar27 = *(ushort *)(lVar58 + 8);
              uVar9 = *(ushort *)(lVar58 + 10);
              uStack_428 = (ulong)*(ushort *)(lVar58 + 4);
              psStack_3d0 = (stbtt__edge *)(ulong)*(ushort *)(lVar58 + 6);
              lStack_380 = lVar58;
              uVar70 = stbtt_GetGlyphShape(psVar62,iVar37,(stbtt_vertex **)&uStack_410);
              uVar73 = ((int)uStack_428 - (int)uStack_438) + 1;
              uStack_310 = (ulong)-uVar34;
              psVar54 = (stbtt__edge *)auStack_34c;
              stbtt_GetGlyphBitmapBoxSubpixel
                        (psStack_3b8,iVar37,(float)auStack_298._0_4_,auStack_2a8._0_4_,fVar76,fVar78
                         ,(int *)&fStack_49c,(int *)psVar54,(int *)0x0,(int *)0x0);
              uStack_3fc = uVar73;
              if (uVar73 != 0) {
                iVar55 = (int)uStack_310 + (int)psStack_3d0 + 1;
                auStack_478._0_4_ = iVar55;
                psVar54 = psStack_3d0;
                if ((iVar55 != 0) && (0 < (int)uVar70)) {
                  puStack_2c0 = puStack_398 + (ulong)uVar9 * lVar74 + (ulong)uVar27;
                  uStack_428 = (ulong)(uint)((int)uStack_428 - (int)uStack_438);
                  psStack_3d0 = (stbtt__edge *)(ulong)((int)psStack_3d0 - uVar34);
                  lVar53 = CONCAT44(uStack_410._4_4_,(stbtt_uint32)uStack_410);
                  fStack_3c4 = (float)auStack_34c._0_4_;
                  psVar54 = (stbtt__edge *)0x0;
                  uVar73 = 0;
                  do {
                    uVar73 = uVar73 + (*(char *)((long)&psVar54->y1 + lVar53) == '\x01');
                    psVar54 = (stbtt__edge *)((long)&psVar54->y1 + 2);
                  } while ((stbtt__edge *)((ulong)uVar70 * 0xe) != psVar54);
                  uStack_498 = fStack_49c;
                  if (uVar73 != 0) {
                    pvStack_420 = ImGui::MemAlloc((ulong)uVar73 * 4);
                    if (pvStack_420 != (void *)0x0) {
                      uVar50 = 1;
                      psVar54 = (stbtt__edge *)0x0;
                      iVar55 = 0;
                      psStack_4a8 = (stbtt__point *)0x0;
                      iVar37 = 0;
                      do {
                        if (((ulong)psVar54 & 1) != 0) {
                          psStack_4a8 = (stbtt__point *)ImGui::MemAlloc((long)iVar37 << 3);
                          if (psStack_4a8 == (stbtt__point *)0x0) {
                            ImGui::MemFree((void *)0x0);
                            ImGui::MemFree(pvStack_420);
                            goto LAB_0018da19;
                          }
                        }
                        asStack_238[0].data =
                             (uchar *)((ulong)asStack_238[0].data & 0xffffffff00000000);
                        auVar104 = ZEXT1664(ZEXT816(0) << 0x40);
                        uVar39 = 0xffffffff;
                        psVar54 = (stbtt__edge *)0x0;
                        do {
                          iVar37 = (int)asStack_238[0].data;
                          switch(*(undefined1 *)((long)&psVar54->y1 + lVar53)) {
                          case 1:
                            if (-1 < (int)uVar39) {
                              *(int *)((long)pvStack_420 + uVar39 * 4) =
                                   (int)asStack_238[0].data - iVar55;
                            }
                            uVar39 = (ulong)((int)uVar39 + 1);
                            auVar80 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar54->x0 + lVar53)))
                            ;
                            auVar80 = vcvtdq2ps_avx(auVar80);
                            auVar104 = ZEXT1664(auVar80);
                            asStack_238[0].data =
                                 (uchar *)CONCAT44(asStack_238[0].data._4_4_,
                                                   (int)asStack_238[0].data + 1);
                            iVar55 = iVar37;
                            if (psStack_4a8 != (stbtt__point *)0x0) {
                              sVar3 = (stbtt__point)vmovlps_avx(auVar80);
                              psStack_4a8[iVar37] = sVar3;
                            }
                            break;
                          case 2:
                            lVar60 = (long)(int)asStack_238[0].data;
                            auVar80 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar54->x0 + lVar53)))
                            ;
                            auVar80 = vcvtdq2ps_avx(auVar80);
                            auVar104 = ZEXT1664(auVar80);
                            asStack_238[0].data =
                                 (uchar *)CONCAT44(asStack_238[0].data._4_4_,
                                                   (int)asStack_238[0].data + 1);
                            if (psStack_4a8 != (stbtt__point *)0x0) {
                              sVar3 = (stbtt__point)vmovlps_avx(auVar80);
                              psStack_4a8[lVar60] = sVar3;
                            }
                            break;
                          case 3:
                            auVar80 = vmovshdup_avx(auVar104._0_16_);
                            stbtt__tesselate_curve
                                      (psStack_4a8,(int *)asStack_238,auVar104._0_4_,auVar80._0_4_,
                                       (float)(int)*(short *)((long)&psVar54->y0 + lVar53),
                                       (float)(int)*(short *)((long)&psVar54->y0 + lVar53 + 2),
                                       (float)(int)*(short *)((long)&psVar54->x0 + lVar53),
                                       (float)(int)*(short *)((long)&psVar54->x0 + lVar53 + 2),
                                       fStack_3bc,0);
                            goto LAB_0018cc4c;
                          case 4:
                            auVar80 = vmovshdup_avx(auVar104._0_16_);
                            auVar139 = ZEXT464((uint)fStack_3bc);
                            stbtt__tesselate_cubic
                                      (psStack_4a8,(int *)asStack_238,auVar104._0_4_,auVar80._0_4_,
                                       (float)(int)*(short *)((long)&psVar54->y0 + lVar53),
                                       (float)(int)*(short *)((long)&psVar54->y0 + lVar53 + 2),
                                       (float)(int)*(short *)((long)&psVar54->x1 + lVar53),
                                       (float)(int)*(short *)((long)&psVar54->x1 + lVar53 + 2),
                                       (float)(int)*(short *)((long)&psVar54->x0 + lVar53),
                                       (float)(int)*(short *)((long)&psVar54->x0 + lVar53 + 2),
                                       fStack_3bc,0);
LAB_0018cc4c:
                            auVar80 = vpmovsxwd_avx(ZEXT416(*(uint *)((long)&psVar54->x0 + lVar53)))
                            ;
                            auVar80 = vcvtdq2ps_avx(auVar80);
                            auVar104 = ZEXT1664(auVar80);
                          }
                          psVar54 = (stbtt__edge *)((long)&psVar54->y1 + 2);
                        } while ((stbtt__edge *)((ulong)uVar70 * 0xe) != psVar54);
                        *(int *)((long)pvStack_420 + (long)(int)uVar39 * 4) =
                             (int)asStack_238[0].data - iVar55;
                        psVar54 = (stbtt__edge *)CONCAT71((int7)(int3)(uVar39 >> 8),1);
                        uVar69 = uVar50 & 1;
                        uVar50 = 0;
                        iVar37 = (int)asStack_238[0].data;
                      } while (uVar69 != 0);
                      if (psStack_4a8 != (stbtt__point *)0x0) {
                        lVar53 = (ulong)uVar73 - 1;
                        auVar147._8_8_ = lVar53;
                        auVar147._0_8_ = lVar53;
                        auVar147._16_8_ = lVar53;
                        auVar147._24_8_ = lVar53;
                        auVar104 = ZEXT1664((undefined1  [16])0x0);
                        psVar54 = (stbtt__edge *)0x0;
                        auVar18 = vpmovsxbq_avx2(ZEXT416(0x3020100));
                        auVar107 = vpmovsxbq_avx2(ZEXT416(0x7060504));
                        auVar102 = vpcmpeqd_avx2(auVar139._0_32_,auVar139._0_32_);
                        do {
                          auVar153._8_8_ = psVar54;
                          auVar153._0_8_ = psVar54;
                          auVar153._16_8_ = psVar54;
                          auVar153._24_8_ = psVar54;
                          auVar103 = vpor_avx2(auVar153,auVar18);
                          auVar154._8_8_ = 0x8000000000000000;
                          auVar154._0_8_ = 0x8000000000000000;
                          auVar154._16_8_ = 0x8000000000000000;
                          auVar154._24_8_ = 0x8000000000000000;
                          auVar119 = vpor_avx2(auVar153,auVar107);
                          auVar119 = vpcmpgtq_avx2(auVar119 ^ auVar154,auVar147 ^ auVar154);
                          auVar103 = vpcmpgtq_avx2(auVar103 ^ auVar154,auVar147 ^ auVar154);
                          auVar119 = vpackssdw_avx2(auVar103,auVar119);
                          auVar80 = vpackssdw_avx(SUB3216(auVar102 ^ auVar119,0),
                                                  SUB3216(auVar102 ^ auVar119,0x10));
                          auVar80 = vpshufd_avx(auVar80,0xd8);
                          auVar103 = vpmovzxwd_avx2(auVar80);
                          auVar103 = vpslld_avx2(auVar103,0x1f);
                          auVar103 = vpmaskmovd_avx2(auVar103,*(undefined1 (*) [32])
                                                               ((long)pvStack_420 +
                                                               (long)psVar54 * 4));
                          auVar153 = auVar104._0_32_;
                          auVar103 = vpaddd_avx2(auVar103,auVar153);
                          auVar104 = ZEXT3264(auVar103);
                          psVar54 = (stbtt__edge *)((long)psVar54 + 8);
                        } while ((stbtt__edge *)(ulong)(uVar73 + 7 & 0xfffffff8) != psVar54);
                        auVar18 = vpermq_avx2(auVar119,0xd8);
                        auVar18 = vblendvps_avx(auVar103,auVar153,auVar18);
                        auVar80 = vphaddd_avx(auVar18._16_16_,auVar18._0_16_);
                        auVar80 = vphaddd_avx(auVar80,auVar80);
                        auVar80 = vphaddd_avx(auVar80,auVar80);
                        auVar139 = ZEXT1664(auVar102._0_16_);
                        psStack_440 = (stbtt__edge *)
                                      ImGui::MemAlloc((long)auVar80._0_4_ * 0x14 + 0x14);
                        if (psStack_440 != (stbtt__edge *)0x0) {
                          uVar39 = 0;
                          uVar70 = 0;
                          iVar55 = 0;
                          do {
                            iVar37 = *(int *)((long)pvStack_420 + uVar39 * 4);
                            if (0 < iVar37) {
                              uVar57 = (ulong)(iVar37 - 1);
                              uVar51 = 0;
                              iVar35 = iVar37;
                              do {
                                iVar75 = (int)uVar57;
                                fVar76 = psStack_4a8[(long)iVar55 + (long)iVar75].y;
                                fVar78 = psStack_4a8[(long)iVar55 + uVar51].y;
                                if ((fVar76 != fVar78) || (NAN(fVar76) || NAN(fVar78))) {
                                  iVar36 = (int)uVar51;
                                  iVar35 = iVar75;
                                  if (fVar76 <= fVar78) {
                                    iVar35 = iVar36;
                                    iVar36 = iVar75;
                                  }
                                  psStack_440[(int)uVar70].invert = (uint)(fVar78 < fVar76);
                                  auVar84._8_8_ = 0;
                                  auVar84._0_4_ = psStack_4a8[(long)iVar55 + (long)iVar35].x;
                                  auVar84._4_4_ = psStack_4a8[(long)iVar55 + (long)iVar35].y;
                                  auVar80 = vmovhps_avx(auVar84,psStack_4a8
                                                                [(long)iVar55 + (long)iVar36]);
                                  fVar77 = auVar80._0_4_ * (float)uStack_248 + 0.0;
                                  fVar88 = auVar80._4_4_ * uStack_248._4_4_ + 0.0;
                                  fVar89 = auVar80._8_4_ * (float)uStack_240 + 0.0;
                                  fVar90 = auVar80._12_4_ * uStack_240._4_4_ + 0.0;
                                  psVar54 = psStack_440 + (int)uVar70;
                                  psVar54->x0 = fVar77;
                                  psVar54->y0 = fVar88;
                                  psVar54->x1 = fVar89;
                                  psVar54->y1 = fVar90;
                                  uVar70 = uVar70 + 1;
                                  iVar35 = *(int *)((long)pvStack_420 + uVar39 * 4);
                                }
                                uVar57 = uVar51 & 0xffffffff;
                                uVar51 = uVar51 + 1;
                              } while ((long)uVar51 < (long)iVar35);
                            }
                            iVar55 = iVar55 + iVar37;
                            uVar39 = uVar39 + 1;
                          } while (uVar39 != uVar73);
                          stbtt__sort_edges_quicksort(psStack_440,uVar70);
                          if (1 < (int)uVar70) {
                            uVar39 = 1;
                            lVar53 = 2;
                            psVar54 = psStack_440;
                            do {
                              uVar1 = psStack_440[uVar39].x0;
                              uVar5 = psStack_440[uVar39].y0;
                              auVar85._4_4_ = uVar5;
                              auVar85._0_4_ = uVar1;
                              auVar85._8_8_ = 0;
                              auVar80 = vmovshdup_avx(auVar85);
                              iVar55 = psStack_440[uVar39].invert;
                              asStack_238[0].cursor = iVar55;
                              asStack_238[0].data = *(uchar **)&psStack_440[uVar39].x1;
                              lVar60 = lVar53;
                              psVar68 = psVar54;
                              do {
                                if (psVar68->y0 <= auVar80._0_4_) {
                                  uVar73 = (int)lVar60 - 1;
                                  goto LAB_0018cf3d;
                                }
                                psVar68[1].invert = psVar68->invert;
                                fVar76 = psVar68->y0;
                                fVar78 = psVar68->x1;
                                fVar92 = psVar68->y1;
                                psVar68[1].x0 = psVar68->x0;
                                psVar68[1].y0 = fVar76;
                                psVar68[1].x1 = fVar78;
                                psVar68[1].y1 = fVar92;
                                lVar60 = lVar60 + -1;
                                psVar68 = psVar68 + -1;
                              } while (1 < lVar60);
                              uVar73 = 0;
LAB_0018cf3d:
                              if (uVar39 != uVar73) {
                                uVar59 = vmovlps_avx(auVar85);
                                psStack_440[(int)uVar73].x0 = (float)(int)uVar59;
                                psStack_440[(int)uVar73].y0 = (float)(int)((ulong)uVar59 >> 0x20);
                                *(uchar **)&psStack_440[(int)uVar73].x1 = asStack_238[0].data;
                                psStack_440[(int)uVar73].invert = iVar55;
                              }
                              uVar39 = uVar39 + 1;
                              lVar53 = lVar53 + 1;
                              psVar54 = psVar54 + 1;
                            } while (uVar39 != uVar70);
                          }
                          auStack_460 = (undefined1  [8])0x0;
                          scanline = asStack_238;
                          if (0x3f < (int)(uint)uStack_428) {
                            scanline = (stbtt__buf *)ImGui::MemAlloc((ulong)uStack_3fc * 8 + 4);
                          }
                          psStack_440[(int)uVar70].y0 =
                               (float)(auStack_478._0_4_ + (int)fStack_3c4) + 1.0;
                          psVar54 = psStack_440;
                          if ((uint)psStack_3d0 < 0x7fffffff) {
                            lStack_2d8 = (long)(int)uStack_3fc;
                            fStack_358 = (float)(int)uStack_498;
                            pfStack_378 = (float *)((long)&scanline->data + lStack_2d8 * 4);
                            pfStack_328 = pfStack_378 + 1;
                            sStack_2c8 = lStack_2d8 * 4;
                            sStack_2d0 = (long)(int)(uint)uStack_428 * 4 + 8;
                            fStack_400 = (float)(int)uStack_3fc;
                            psStack_390 = (stbtt__edge *)0x0;
                            uStack_388 = 0;
                            puStack_3b0 = (undefined8 *)0x0;
                            iStack_3c0 = 0;
                            psStack_418 = (stbtt__active_edge *)0x0;
                            auVar44 = (undefined1  [8])(stbtt__active_edge *)0x0;
                            psVar68 = psStack_440;
                            fVar76 = fStack_3c4;
                            do {
                              fVar78 = fStack_3c4;
                              fVar92 = (float)(int)fVar76;
                              auStack_458._0_4_ = fVar92 + 1.0;
                              fStack_364 = fVar76;
                              memset(scanline,0,sStack_2c8);
                              memset(pfStack_378,0,sStack_2d0);
                              if (auVar44 != (undefined1  [8])0x0) {
                                psVar46 = (stbtt__active_edge *)auStack_460;
                                do {
                                  if (((stbtt__active_edge *)auVar44)->ey <= fVar92) {
                                    psVar46->next = ((stbtt__active_edge *)auVar44)->next;
                                    if ((((stbtt__active_edge *)auVar44)->direction == 0.0) &&
                                       (!NAN(((stbtt__active_edge *)auVar44)->direction))) {
                                      __assert_fail("z->direction",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xc63,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    ((stbtt__active_edge *)auVar44)->direction = 0.0;
                                    ((stbtt__active_edge *)auVar44)->next = psStack_418;
                                    psStack_418 = (stbtt__active_edge *)auVar44;
                                    auVar44 = (undefined1  [8])psVar46;
                                  }
                                  ppsVar25 = &((stbtt__active_edge *)auVar44)->next;
                                  psVar46 = (stbtt__active_edge *)auVar44;
                                  auVar44 = (undefined1  [8])*ppsVar25;
                                } while (*ppsVar25 != (stbtt__active_edge *)0x0);
                              }
                              fVar76 = psVar68->y0;
                              auVar44 = auStack_460;
                              if (fVar76 <= (float)auStack_458._0_4_) {
                                bVar26 = (int)uStack_388 == 0;
                                uVar59 = extraout_RDX;
                                do {
                                  psVar46 = psStack_418;
                                  fVar113 = psVar68->y1;
                                  if ((fVar76 != fVar113) || (NAN(fVar76) || NAN(fVar113))) {
                                    if (psStack_418 == (stbtt__active_edge *)0x0) {
                                      if (iStack_3c0 == 0) {
                                        puVar45 = (undefined8 *)ImGui::MemAlloc(0x6408);
                                        if (puVar45 == (undefined8 *)0x0) {
                                          __assert_fail("z != __null",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xad1,
                                                  "stbtt__active_edge *stbtt__new_active(stbtt__hheap *, stbtt__edge *, int, float, void *)"
                                                  );
                                        }
                                        *puVar45 = puStack_3b0;
                                        fVar76 = psVar68->y0;
                                        fVar113 = psVar68->y1;
                                        iStack_3c0 = 799;
                                        uVar59 = extraout_RDX_00;
                                      }
                                      else {
                                        iStack_3c0 = iStack_3c0 + -1;
                                        puVar45 = puStack_3b0;
                                      }
                                      puStack_3b0 = puVar45;
                                      psVar46 = (stbtt__active_edge *)
                                                (puVar45 + (long)iStack_3c0 * 4 + 1);
                                      psStack_418 = (stbtt__active_edge *)0x0;
                                    }
                                    else {
                                      psStack_418 = psStack_418->next;
                                    }
                                    fVar94 = psVar68->x0;
                                    auVar99._0_4_ = (psVar68->x1 - fVar94) / (fVar113 - fVar76);
                                    auVar99._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                    psVar46->fdx = auVar99._0_4_;
                                    auVar95 = vcmpss_avx(auVar99,ZEXT416(0),4);
                                    auVar105._0_4_ = 1.0 / auVar99._0_4_;
                                    auVar105._4_12_ = SUB6012((undefined1  [60])0x0,0);
                                    auVar80 = vblendps_avx(auVar105,_DAT_001ee7c0,0xe);
                                    psVar46->fx = (auVar99._0_4_ * (fVar92 - fVar76) + fVar94) -
                                                  fStack_358;
                                    uVar59 = CONCAT71((int7)((ulong)uVar59 >> 8),
                                                      psVar68->invert == 0);
                                    auVar95 = vpinsrb_avx(ZEXT416(auVar95._0_4_),(int)uVar59,4);
                                    auVar95 = vpslld_avx(auVar95,0x1f);
                                    auVar80 = vblendvps_avx(ZEXT816(0x3f80000000000000),auVar80,
                                                            auVar95);
                                    uVar4 = vmovlps_avx(auVar80);
                                    psVar46->fdy = (float)(int)uVar4;
                                    psVar46->direction = (float)(int)((ulong)uVar4 >> 0x20);
                                    psVar46->sy = fVar76;
                                    psVar46->ey = fVar113;
                                    psVar46->next = (stbtt__active_edge *)0x0;
                                    if (fVar113 < fVar92 && (bVar26 && fVar78 != 0.0)) {
                                      psVar46->ey = fVar92;
                                      fVar113 = fVar92;
                                    }
                                    if (fVar113 < fVar92) {
                                      __assert_fail("z->ey >= scan_y_top",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xc76,
                                                  "void stbtt__rasterize_sorted_edges(stbtt__bitmap *, stbtt__edge *, int, int, int, int, void *)"
                                                  );
                                    }
                                    psVar46->next = (stbtt__active_edge *)auStack_460;
                                    auStack_460 = (undefined1  [8])psVar46;
                                  }
                                  else {
                                  }
                                  fVar76 = psVar68[1].y0;
                                  psVar68 = psVar68 + 1;
                                  auVar44 = auStack_460;
                                } while (fVar76 <= (float)auStack_458._0_4_);
                              }
                              for (; auVar44 != (undefined1  [8])0x0;
                                  auVar44 = (undefined1  [8])((stbtt__active_edge *)auVar44)->next)
                              {
                                fVar76 = ((stbtt__active_edge *)auVar44)->ey;
                                if (fVar76 < fVar92) {
                                  __assert_fail("e->ey >= y_top",
                                                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                ,0xba5,
                                                "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                               );
                                }
                                fVar78 = ((stbtt__active_edge *)auVar44)->fx;
                                auVar104 = ZEXT464((uint)fVar78);
                                fVar113 = ((stbtt__active_edge *)auVar44)->fdx;
                                auVar80 = ZEXT416((uint)fVar78);
                                if ((fVar113 != 0.0) || (NAN(fVar113))) {
                                  fVar94 = ((stbtt__active_edge *)auVar44)->sy;
                                  if ((float)auStack_458._0_4_ < fVar94) {
                                    __assert_fail("e->sy <= y_bottom && e->ey >= y_top",
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,3000,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                 );
                                  }
                                  fVar93 = fVar113 + fVar78;
                                  auVar139 = ZEXT464((uint)fVar93);
                                  auVar95 = vcmpss_avx(ZEXT416((uint)fVar92),ZEXT416((uint)fVar94),1
                                                      );
                                  auVar95 = vblendvps_avx(auVar80,ZEXT416((uint)(fVar113 * (fVar94 -
                                                                                           fVar92) +
                                                                                fVar78)),auVar95);
                                  fVar108 = auVar95._0_4_;
                                  if (0.0 <= fVar108) {
                                    auVar95 = vcmpss_avx(ZEXT416((uint)fVar76),
                                                         ZEXT416((uint)auStack_458._0_4_),1);
                                    auVar95 = vblendvps_avx(ZEXT416((uint)fVar93),
                                                            ZEXT416((uint)(fVar113 * (fVar76 - 
                                                  fVar92) + fVar78)),auVar95);
                                    fVar114 = auVar95._0_4_;
                                    if (((0.0 <= fVar114) && (fVar108 < fStack_400)) &&
                                       (fVar114 < fStack_400)) {
                                      auVar80 = vmaxss_avx(ZEXT416((uint)fVar94),
                                                           ZEXT416((uint)fVar92));
                                      uVar73 = (uint)fVar108;
                                      auVar95 = vminss_avx(ZEXT416((uint)fVar76),
                                                           ZEXT416((uint)auStack_458._0_4_));
                                      uVar70 = (uint)fVar114;
                                      fVar113 = auVar80._0_4_;
                                      fVar76 = auVar95._0_4_;
                                      if (uVar73 == uVar70) {
                                        if (((int)uVar73 < 0) ||
                                           ((int)(uint)uStack_428 < (int)uVar73)) {
                                          __assert_fail("x >= 0 && x < len",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xbd4,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar39 = (ulong)uVar73;
                                        *(float *)((long)&scanline->data + uVar39 * 4) =
                                             (((fVar108 - (float)(int)uVar73) +
                                              (fVar114 - (float)(int)uVar73)) * -0.5 + 1.0) *
                                             ((stbtt__active_edge *)auVar44)->direction *
                                             (fVar76 - fVar113) +
                                             *(float *)((long)&scanline->data + uVar39 * 4);
                                        fVar78 = (fVar76 - fVar113) *
                                                 ((stbtt__active_edge *)auVar44)->direction;
                                      }
                                      else {
                                        fVar94 = ((stbtt__active_edge *)auVar44)->fdy;
                                        uVar50 = uVar73;
                                        fVar115 = fVar108;
                                        if (fVar114 < fVar108) {
                                          fVar78 = fVar92 - fVar76;
                                          fVar76 = (float)auStack_458._0_4_ + (fVar92 - fVar113);
                                          fVar113 = (float)auStack_458._0_4_ + fVar78;
                                          fVar94 = (float)((uint)fVar94 ^ auStack_2f8._0_4_);
                                          uVar50 = uVar70;
                                          uVar70 = uVar73;
                                          fVar78 = fVar93;
                                          fVar115 = fVar114;
                                          fVar114 = fVar108;
                                        }
                                        iVar55 = uVar50 + 1;
                                        fVar93 = ((float)iVar55 - fVar78) * fVar94 + fVar92;
                                        fVar78 = ((stbtt__active_edge *)auVar44)->direction;
                                        fVar108 = fVar78 * (fVar93 - fVar113);
                                        lVar53 = (long)(int)uVar50;
                                        *(float *)((long)&scanline->data + lVar53 * 4) =
                                             fVar108 * (((fVar115 - (float)(int)uVar50) + 1.0) *
                                                        -0.5 + 1.0) +
                                             *(float *)((long)&scanline->data + lVar53 * 4);
                                        if (uVar70 - iVar55 != 0 && iVar55 <= (int)uVar70) {
                                          do {
                                            *(float *)((long)&scanline->data + lVar53 * 4 + 4) =
                                                 fVar94 * fVar78 * 0.5 + fVar108 +
                                                 *(float *)((long)&scanline->data + lVar53 * 4 + 4);
                                            fVar108 = fVar94 * fVar78 + fVar108;
                                            lVar53 = lVar53 + 1;
                                          } while (uVar70 - 1 != (int)lVar53);
                                        }
                                        auVar100._8_4_ = 0x7fffffff;
                                        auVar100._0_8_ = 0x7fffffff7fffffff;
                                        auVar100._12_4_ = 0x7fffffff;
                                        auVar80 = vandps_avx(ZEXT416((uint)fVar108),auVar100);
                                        auVar139 = ZEXT464(0x3f8147ae);
                                        if (1.01 < auVar80._0_4_) {
                                          __assert_fail("fabsf(area) <= 1.01f",
                                                                                                                
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                                  ,0xbfb,
                                                  "void stbtt__fill_active_edges_new(float *, float *, int, stbtt__active_edge *, float)"
                                                  );
                                        }
                                        uVar39 = (ulong)(int)uVar70;
                                        *(float *)((long)&scanline->data + uVar39 * 4) =
                                             fVar78 * (((fVar114 - (float)(int)uVar70) + 0.0) * -0.5
                                                      + 1.0) *
                                             (fVar76 - (fVar94 * (float)(int)(uVar70 - iVar55) +
                                                       fVar93)) + fVar108 +
                                             *(float *)((long)&scanline->data + uVar39 * 4);
                                        fVar78 = fVar78 * (fVar76 - fVar113);
                                      }
                                      pfStack_328[uVar39] = fVar78 + pfStack_328[uVar39];
                                      goto LAB_0018d8b4;
                                    }
                                  }
                                  if ((uint)uStack_428 < 0x7fffffff) {
                                    uStack_370 = CONCAT44(uStack_370._4_4_,fVar113);
                                    auStack_3f8 = ZEXT416((uint)fVar93);
                                    auStack_34c._4_16_ = auVar80;
                                    uVar70 = 0;
                                    fVar76 = uStack_498;
                                    do {
                                      fVar108 = (float)(int)uVar70;
                                      uVar73 = uVar70 + 1;
                                      fVar93 = (float)(int)uVar73;
                                      fVar94 = auVar104._0_4_;
                                      fVar78 = (fVar108 - fVar94) / fVar113 + fVar92;
                                      uStack_498 = (fVar93 - fVar94) / fVar113 + fVar92;
                                      fVar113 = auVar139._0_4_;
                                      if ((fVar108 <= fVar94) || (fVar113 <= fVar93)) {
                                        if ((fVar108 <= fVar113) || (fVar94 <= fVar93)) {
                                          fVar114 = fVar92;
                                          if (((fVar108 <= fVar94) || (fVar113 <= fVar108)) &&
                                             ((fVar108 <= fVar113 || (fVar94 <= fVar108)))) {
                                            if (((fVar94 < fVar93) && (fVar93 < fVar113)) ||
                                               ((fVar113 < fVar93 && (fVar93 < fVar94)))) {
                                              auStack_478._0_4_ = fVar93;
                                              fVar78 = fVar92;
                                              goto LAB_0018d592;
                                            }
                                            auVar80 = auVar139._0_16_;
                                            fVar78 = fVar92;
                                            fVar108 = fVar94;
                                            uStack_498 = fVar76;
                                            goto LAB_0018d650;
                                          }
                                        }
                                        else {
                                          auStack_478._0_4_ = fVar93;
                                          stbtt__handle_clipped_edge
                                                    ((float *)scanline,uVar70,
                                                     (stbtt__active_edge *)auVar44,fVar94,fVar92,
                                                     fVar93,uStack_498);
                                          fVar94 = (float)auStack_478._0_4_;
                                          fVar114 = uStack_498;
                                          fVar76 = uStack_498;
                                        }
                                        uStack_498 = fVar76;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar70,
                                                   (stbtt__active_edge *)auVar44,fVar94,fVar114,
                                                   fVar108,fVar78);
                                        auVar80 = auStack_3f8;
                                      }
                                      else {
                                        auStack_478._0_4_ = fVar93;
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar70,
                                                   (stbtt__active_edge *)auVar44,fVar94,fVar92,
                                                   fVar108,fVar78);
                                        fVar94 = fVar108;
                                        fVar93 = (float)auStack_478._0_4_;
LAB_0018d592:
                                        stbtt__handle_clipped_edge
                                                  ((float *)scanline,uVar70,
                                                   (stbtt__active_edge *)auVar44,fVar94,fVar78,
                                                   fVar93,uStack_498);
                                        auVar80 = auStack_3f8;
                                        fVar78 = uStack_498;
                                        fVar108 = (float)auStack_478._0_4_;
                                      }
LAB_0018d650:
                                      stbtt__handle_clipped_edge
                                                ((float *)scanline,uVar70,
                                                 (stbtt__active_edge *)auVar44,fVar108,fVar78,
                                                 auVar80._0_4_,(float)auStack_458._0_4_);
                                      auVar104 = ZEXT1664(auStack_34c._4_16_);
                                      auVar139 = ZEXT1664(auStack_3f8);
                                      fVar113 = (float)uStack_370;
                                      uVar70 = uVar73;
                                      fVar76 = uStack_498;
                                    } while (uStack_3fc != uVar73);
                                  }
                                }
                                else if (fVar78 < fStack_400) {
                                  if (0.0 <= fVar78) {
                                    auStack_34c._4_16_ = auVar80;
                                    stbtt__handle_clipped_edge
                                              ((float *)scanline,(int)fVar78,
                                               (stbtt__active_edge *)auVar44,fVar78,fVar92,fVar78,
                                               (float)auStack_458._0_4_);
                                    iVar55 = (int)fVar78 + 1;
                                    auVar80 = auStack_34c._4_16_;
                                  }
                                  else {
                                    iVar55 = 0;
                                  }
                                  stbtt__handle_clipped_edge
                                            (pfStack_378,iVar55,(stbtt__active_edge *)auVar44,
                                             auVar80._0_4_,fVar92,auVar80._0_4_,
                                             (float)auStack_458._0_4_);
                                }
LAB_0018d8b4:
                              }
                              auVar44 = auStack_460;
                              if ((uint)uStack_428 < 0x7fffffff) {
                                fVar76 = 0.0;
                                psVar47 = scanline;
                                psVar54 = psStack_390;
                                lVar53 = lStack_2d8;
                                do {
                                  fVar76 = fVar76 + *(float *)((long)&psVar47->data + lStack_2d8 * 4
                                                              );
                                  auVar96._8_4_ = 0x7fffffff;
                                  auVar96._0_8_ = 0x7fffffff7fffffff;
                                  auVar96._12_4_ = 0x7fffffff;
                                  auVar80 = vandps_avx(ZEXT416((uint)(fVar76 + *(float *)&psVar47->
                                                  data)),auVar96);
                                  iVar55 = (int)(auVar80._0_4_ * 255.0 + 0.5);
                                  uVar64 = (uchar)iVar55;
                                  if (0xfe < iVar55) {
                                    uVar64 = 0xff;
                                  }
                                  puStack_2c0[(int)psVar54] = uVar64;
                                  psVar54 = (stbtt__edge *)(ulong)((int)psVar54 + 1);
                                  psVar47 = (stbtt__buf *)((long)&psVar47->data + 4);
                                  lVar53 = lVar53 + -1;
                                } while (lVar53 != 0);
                              }
                              for (; auVar44 != (undefined1  [8])0x0;
                                  auVar44 = (undefined1  [8])((stbtt__active_edge *)auVar44)->next)
                              {
                                ((stbtt__active_edge *)auVar44)->fx =
                                     ((stbtt__active_edge *)auVar44)->fdx +
                                     ((stbtt__active_edge *)auVar44)->fx;
                              }
                              fVar76 = (float)((int)fStack_364 + 1);
                              iVar55 = (int)uStack_388;
                              uStack_388 = (ulong)(iVar55 + 1);
                              psStack_390 = (stbtt__edge *)
                                            (ulong)(uint)((int)psStack_390 + iStack_42c);
                              auVar44 = auStack_460;
                              psVar54 = psStack_390;
                              puVar45 = puStack_3b0;
                            } while (iVar55 != (uint)psStack_3d0);
                            while (puVar45 != (undefined8 *)0x0) {
                              puVar13 = (undefined8 *)*puVar45;
                              ImGui::MemFree(puVar45);
                              puVar45 = puVar13;
                            }
                          }
                          if (scanline != asStack_238) {
                            ImGui::MemFree(scanline);
                          }
                          ImGui::MemFree(psStack_440);
                        }
                        ImGui::MemFree(pvStack_420);
                        ImGui::MemFree(psStack_4a8);
                      }
                    }
                  }
                }
              }
LAB_0018da19:
              uVar38 = (undefined4)((ulong)psVar54 >> 0x20);
              ImGui::MemFree((void *)CONCAT44(uStack_410._4_4_,(stbtt_uint32)uStack_410));
              uVar73 = *(uint *)(lStack_380 + 8);
              uVar70 = *(uint *)(lStack_380 + 4);
              auVar80 = ZEXT416(uVar70);
              if (1 < (byte)uStack_300) {
                iVar55 = vpextrw_avx(ZEXT416(uVar70),1);
                asStack_238[0].data = (uchar *)0x0;
                if (iVar55 == 0) {
                  auVar80 = vpmovzxwq_avx(ZEXT416(uVar70));
                }
                else {
                  iVar75 = vpextrw_avx(ZEXT416(uVar70),0);
                  uVar38 = vpextrw_avx(ZEXT416(uVar73),0);
                  iVar37 = vpextrw_avx(ZEXT416(uVar73),1);
                  puVar43 = puStack_398 +
                            (long)(iVar37 * iStack_42c) +
                            CONCAT44((int)((ulong)lStack_380 >> 0x20),uVar38);
                  iVar37 = iVar75 - (int)uStack_438;
                  uVar70 = iVar37 + 1;
                  uVar39 = (ulong)uVar70;
                  iVar35 = 0;
                  do {
                    uVar51 = uStack_300;
                    memset(asStack_238,0,uStack_300);
                    uVar73 = uVar70;
                    switch((int)uVar51) {
                    case 2:
                      if (iVar37 < 0) {
LAB_0018dc36:
                        uVar51 = 0;
                        uVar73 = 0;
                      }
                      else {
                        uVar57 = 0;
                        uVar51 = 0;
                        do {
                          bVar6 = puVar43[uVar57];
                          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 2 & 7)) =
                               bVar6;
                          uVar50 = (int)uVar51 + ((uint)bVar6 - (uint)bVar7);
                          uVar51 = (ulong)uVar50;
                          puVar43[uVar57] = (uchar)(uVar50 >> 1);
                          uVar57 = uVar57 + 1;
                        } while (uVar39 != uVar57);
                      }
                      break;
                    case 3:
                      if (iVar37 < 0) goto LAB_0018dc36;
                      uVar57 = 0;
                      uVar51 = 0;
                      do {
                        bVar6 = puVar43[uVar57];
                        bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                        *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 3 & 7)) =
                             bVar6;
                        uVar51 = (ulong)((int)uVar51 + ((uint)bVar6 - (uint)bVar7));
                        puVar43[uVar57] = (uchar)(uVar51 / 3);
                        uVar57 = uVar57 + 1;
                      } while (uVar39 != uVar57);
                      break;
                    case 4:
                      if (iVar37 < 0) goto LAB_0018dc36;
                      uVar57 = 0;
                      uVar51 = 0;
                      do {
                        bVar6 = puVar43[uVar57];
                        uVar65 = (ulong)((uint)uVar57 & 7);
                        bVar7 = *(byte *)((long)&asStack_238[0].data + uVar65);
                        *(byte *)((long)&asStack_238[0].data + (uVar65 ^ 4)) = bVar6;
                        uVar50 = (int)uVar51 + ((uint)bVar6 - (uint)bVar7);
                        uVar51 = (ulong)uVar50;
                        puVar43[uVar57] = (uchar)(uVar50 >> 2);
                        uVar57 = uVar57 + 1;
                      } while (uVar39 != uVar57);
                      break;
                    case 5:
                      if (iVar37 < 0) goto LAB_0018dc36;
                      uVar57 = 0;
                      uVar51 = 0;
                      do {
                        bVar6 = puVar43[uVar57];
                        bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                        *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 5 & 7)) =
                             bVar6;
                        uVar51 = (ulong)((int)uVar51 + ((uint)bVar6 - (uint)bVar7));
                        puVar43[uVar57] = (uchar)(uVar51 / 5);
                        uVar57 = uVar57 + 1;
                      } while (uVar39 != uVar57);
                      break;
                    default:
                      if (iVar37 < 0) {
                        uVar51 = 0;
                        uVar73 = 0;
                      }
                      else {
                        uVar57 = 0;
                        uVar51 = 0;
                        do {
                          bVar6 = puVar43[uVar57];
                          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                          *(byte *)((long)&asStack_238[0].data +
                                   (ulong)((int)uStack_438 + (uint)uVar57 & 7)) = bVar6;
                          uVar51 = (ulong)((int)uVar51 + ((uint)bVar6 - (uint)bVar7));
                          puVar43[uVar57] = (uchar)(uVar51 / (uStack_438 & 0xffffffff));
                          uVar57 = uVar57 + 1;
                        } while (uVar39 != uVar57);
                      }
                    }
                    if ((int)uVar73 < iVar75) {
                      uVar57 = (ulong)uVar73;
                      do {
                        if (puVar43[uVar57] != '\0') {
                          __assert_fail("pixels[i] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                        ,0xf41,
                                        "void stbtt__h_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar51 = (ulong)((int)uVar51 -
                                        (uint)*(byte *)((long)&asStack_238[0].data +
                                                       (ulong)((uint)uVar57 & 7)));
                        puVar43[uVar57] = (uchar)(uVar51 / (uStack_438 & 0xffffffff));
                        uVar57 = uVar57 + 1;
                      } while ((int)uVar57 < iVar75);
                    }
                    uVar38 = 0;
                    puVar43 = puVar43 + lVar74;
                    iVar35 = iVar35 + 1;
                  } while (iVar35 != iVar55);
                  uVar73 = *(uint *)(lStack_380 + 8);
                  auVar80 = ZEXT416(*(uint *)(lStack_380 + 4));
                }
              }
              auVar95 = ZEXT416(uVar73);
              if (1 < (byte)uStack_308) {
                asStack_238[0].data = (uchar *)0x0;
                if (auVar80._0_2_ == 0) {
                  auVar80 = vpblendw_avx(auVar80,_DAT_001e30b0,0xfd);
                }
                else {
                  iVar35 = vpextrw_avx(auVar80,1);
                  uVar49 = vpextrw_avx(auVar95,0);
                  auStack_478._0_4_ = auVar80._0_4_ & 0xffff;
                  iVar55 = vpextrw_avx(auVar95,1);
                  pbVar72 = puStack_398 + (long)(iVar55 * iStack_42c) + CONCAT44(uVar38,uVar49);
                  iVar37 = iVar35 - uVar34;
                  uVar70 = iVar35 + (int)uStack_310 + 1;
                  uVar39 = (ulong)uVar70;
                  iVar75 = 0;
                  iVar55 = iVar35;
                  do {
                    uVar51 = uStack_308;
                    memset(asStack_238,0,uStack_308);
                    uVar73 = uVar70;
                    switch((int)uVar51) {
                    case 2:
                      if (iVar37 < 0) {
LAB_0018df31:
                        uVar51 = 0;
                        uVar73 = 0;
                      }
                      else {
                        uVar57 = 0;
                        uVar51 = 0;
                        pbVar67 = pbVar72;
                        do {
                          bVar6 = *pbVar67;
                          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 2 & 7)) =
                               bVar6;
                          uVar50 = (int)uVar51 + ((uint)bVar6 - (uint)bVar7);
                          uVar51 = (ulong)uVar50;
                          *pbVar67 = (byte)(uVar50 >> 1);
                          uVar57 = uVar57 + 1;
                          pbVar67 = pbVar67 + lVar74;
                        } while (uVar39 != uVar57);
                      }
                      break;
                    case 3:
                      if (iVar37 < 0) goto LAB_0018df31;
                      uVar57 = 0;
                      uVar51 = 0;
                      pbVar67 = pbVar72;
                      do {
                        bVar6 = *pbVar67;
                        bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                        *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 3 & 7)) =
                             bVar6;
                        uVar51 = (ulong)((int)uVar51 + ((uint)bVar6 - (uint)bVar7));
                        *pbVar67 = (byte)(uVar51 / 3);
                        uVar57 = uVar57 + 1;
                        pbVar67 = pbVar67 + lVar74;
                      } while (uVar39 != uVar57);
                      break;
                    case 4:
                      if (iVar37 < 0) goto LAB_0018df31;
                      uVar57 = 0;
                      uVar51 = 0;
                      pbVar67 = pbVar72;
                      do {
                        bVar6 = *pbVar67;
                        uVar65 = (ulong)((uint)uVar57 & 7);
                        bVar7 = *(byte *)((long)&asStack_238[0].data + uVar65);
                        *(byte *)((long)&asStack_238[0].data + (uVar65 ^ 4)) = bVar6;
                        uVar50 = (int)uVar51 + ((uint)bVar6 - (uint)bVar7);
                        uVar51 = (ulong)uVar50;
                        *pbVar67 = (byte)(uVar50 >> 2);
                        uVar57 = uVar57 + 1;
                        pbVar67 = pbVar67 + lVar74;
                      } while (uVar39 != uVar57);
                      break;
                    case 5:
                      if (iVar37 < 0) goto LAB_0018df31;
                      uVar57 = 0;
                      uVar51 = 0;
                      pbVar67 = pbVar72;
                      do {
                        bVar6 = *pbVar67;
                        bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                        *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 + 5 & 7)) =
                             bVar6;
                        uVar51 = (ulong)((int)uVar51 + ((uint)bVar6 - (uint)bVar7));
                        *pbVar67 = (byte)(uVar51 / 5);
                        uVar57 = uVar57 + 1;
                        pbVar67 = pbVar67 + lVar74;
                      } while (uVar39 != uVar57);
                      break;
                    default:
                      if (iVar37 < 0) {
                        uVar51 = 0;
                        uVar73 = 0;
                      }
                      else {
                        uVar57 = 0;
                        uVar51 = 0;
                        pbVar67 = pbVar72;
                        do {
                          bVar6 = *pbVar67;
                          bVar7 = *(byte *)((long)&asStack_238[0].data + (ulong)((uint)uVar57 & 7));
                          *(byte *)((long)&asStack_238[0].data + (ulong)(uVar34 + (uint)uVar57 & 7))
                               = bVar6;
                          uVar50 = (int)uVar51 + ((uint)bVar6 - (uint)bVar7);
                          uVar51 = (ulong)uVar50;
                          *pbVar67 = (byte)(uVar50 / uVar34);
                          uVar57 = uVar57 + 1;
                          pbVar67 = pbVar67 + lVar74;
                        } while (uVar39 != uVar57);
                      }
                    }
                    if ((int)uVar73 < iVar55) {
                      lVar53 = (long)(int)uVar73;
                      pbVar67 = pbVar72 + lVar74 * lVar53;
                      do {
                        if (*pbVar67 != 0) {
                          __assert_fail("pixels[i*stride_in_bytes] == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imstb_truetype.h"
                                        ,0xf7f,
                                        "void stbtt__v_prefilter(unsigned char *, int, int, int, unsigned int)"
                                       );
                        }
                        uVar73 = (int)uVar51 -
                                 (uint)*(byte *)((long)&asStack_238[0].data +
                                                (ulong)((uint)lVar53 & 7));
                        uVar51 = (ulong)uVar73;
                        *pbVar67 = (byte)(uVar73 / uVar34);
                        lVar53 = lVar53 + 1;
                        pbVar67 = pbVar67 + lVar74;
                      } while (iVar35 != (int)lVar53);
                    }
                    pbVar72 = pbVar72 + 1;
                    iVar75 = iVar75 + 1;
                  } while (iVar75 != auStack_478._0_4_);
                  auVar95 = ZEXT416(*(uint *)(lStack_380 + 8));
                  auVar80 = ZEXT416(*(uint *)(lStack_380 + 4));
                }
              }
              *puStack_2b8 = auVar95._0_4_;
              auVar95 = vpaddw_avx(auVar95,auVar80);
              puStack_2b8[1] = auVar95._0_4_;
              puStack_2b8[4] =
                   (float)(int)(short)((short)(uStack_35c << 8) + (short)uStack_360) * fStack_404;
              auVar79 = vpinsrd_avx(ZEXT416(uStack_350),iStack_354,1);
              auVar95 = vcvtdq2ps_avx(auVar79);
              auVar104 = ZEXT1664(auStack_258);
              auVar97._0_4_ = auVar95._0_4_ * auStack_258._0_4_ + auStack_268._0_4_;
              auVar97._4_4_ = auVar95._4_4_ * auStack_258._4_4_ + auStack_268._4_4_;
              auVar97._8_4_ = auVar95._8_4_ * auStack_258._8_4_ + auStack_268._8_4_;
              auVar97._12_4_ = auVar95._12_4_ * auStack_258._12_4_ + auStack_268._12_4_;
              uVar59 = vmovlps_avx(auVar97);
              *(undefined8 *)(puStack_2b8 + 2) = uVar59;
              auVar80 = vpmovzxwd_avx(auVar80);
              auVar80 = vpaddd_avx(auVar79,auVar80);
              auVar80 = vcvtdq2ps_avx(auVar80);
              auVar86._0_4_ = auVar80._0_4_ * auStack_258._0_4_ + auStack_268._0_4_;
              auVar86._4_4_ = auVar80._4_4_ * auStack_258._4_4_ + auStack_268._4_4_;
              auVar86._8_4_ = auVar80._8_4_ * auStack_258._8_4_ + auStack_268._8_4_;
              auVar86._12_4_ = auVar80._12_4_ * auStack_258._12_4_ + auStack_268._12_4_;
              uVar59 = vmovlps_avx(auVar86);
              *(undefined8 *)(puStack_2b8 + 5) = uVar59;
              iVar55 = psStack_3b8[1].fontstart;
              lVar53 = lStack_320;
              lVar60 = lStack_318;
              atlas = pIStack_480;
              psVar62 = psStack_3b8;
            }
            lVar60 = lVar60 + 1;
          } while (lVar60 < iVar55);
        }
        fVar76 = pIStack_2e0[lStack_330].RasterizerMultiply;
        if ((fVar76 != 1.0) || (NAN(fVar76))) {
          lVar53 = 0;
          auVar102 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          auVar18 = vpmovsxbd_avx2(ZEXT816(0xf0e0d0c0b0a0908));
          auVar107 = vpmovsxbd_avx2(ZEXT816(0x1716151413121110));
          auVar119 = vpmovsxbd_avx2(ZEXT816(0x1f1e1d1c1b1a1918));
          auVar157._8_4_ = 0x53000080;
          auVar157._0_8_ = 0x5300008053000080;
          auVar157._12_4_ = 0x53000080;
          auVar157._16_4_ = 0x53000080;
          auVar157._20_4_ = 0x53000080;
          auVar157._24_4_ = 0x53000080;
          auVar157._28_4_ = 0x53000080;
          auVar158._8_4_ = 0x4f000000;
          auVar158._0_8_ = 0x4f0000004f000000;
          auVar158._12_4_ = 0x4f000000;
          auVar158._16_4_ = 0x4f000000;
          auVar158._20_4_ = 0x4f000000;
          auVar158._24_4_ = 0x4f000000;
          auVar158._28_4_ = 0x4f000000;
          do {
            auVar110._8_4_ = 0x4b000000;
            auVar110._0_8_ = 0x4b0000004b000000;
            auVar110._12_4_ = 0x4b000000;
            auVar110._16_4_ = 0x4b000000;
            auVar110._20_4_ = 0x4b000000;
            auVar110._24_4_ = 0x4b000000;
            auVar110._28_4_ = 0x4b000000;
            auVar111 = vpblendw_avx2(auVar18,auVar110,0xaa);
            auVar129._8_4_ = 0x53000000;
            auVar129._0_8_ = 0x5300000053000000;
            auVar129._12_4_ = 0x53000000;
            auVar129._16_4_ = 0x53000000;
            auVar129._20_4_ = 0x53000000;
            auVar129._24_4_ = 0x53000000;
            auVar129._28_4_ = 0x53000000;
            auVar103 = vpsrld_avx2(auVar18,0x10);
            auVar103 = vpblendw_avx2(auVar103,auVar129,0xaa);
            auVar103 = vsubps_avx(auVar103,auVar157);
            fVar127 = auVar103._28_4_ + auVar111._28_4_;
            auVar155 = vpblendw_avx2(auVar102,auVar110,0xaa);
            auVar147 = vpsrld_avx2(auVar102,0x10);
            auVar147 = vpblendw_avx2(auVar147,auVar129,0xaa);
            auVar147 = vsubps_avx(auVar147,auVar157);
            fVar146 = auVar155._28_4_ + auVar147._28_4_;
            auVar16 = vpblendw_avx2(auVar119,auVar110,0xaa);
            auVar153 = vpsrld_avx2(auVar119,0x10);
            auVar153 = vpblendw_avx2(auVar153,auVar129,0xaa);
            auVar153 = vsubps_avx(auVar153,auVar157);
            auVar17 = vpblendw_avx2(auVar107,auVar110,0xaa);
            auVar154 = vpsrld_avx2(auVar107,0x10);
            auVar154 = vpblendw_avx2(auVar154,auVar129,0xaa);
            auVar154 = vsubps_avx(auVar154,auVar157);
            fVar78 = auVar154._28_4_;
            fVar116 = auVar17._28_4_ + fVar78;
            fVar92 = fVar76 * (auVar17._0_4_ + auVar154._0_4_);
            fVar113 = fVar76 * (auVar17._4_4_ + auVar154._4_4_);
            auVar19._4_4_ = fVar113;
            auVar19._0_4_ = fVar92;
            fVar94 = fVar76 * (auVar17._8_4_ + auVar154._8_4_);
            auVar19._8_4_ = fVar94;
            fVar93 = fVar76 * (auVar17._12_4_ + auVar154._12_4_);
            auVar19._12_4_ = fVar93;
            fVar108 = fVar76 * (auVar17._16_4_ + auVar154._16_4_);
            auVar19._16_4_ = fVar108;
            fVar114 = fVar76 * (auVar17._20_4_ + auVar154._20_4_);
            auVar19._20_4_ = fVar114;
            fVar115 = fVar76 * (auVar17._24_4_ + auVar154._24_4_);
            auVar19._24_4_ = fVar115;
            auVar19._28_4_ = fVar116;
            fVar128 = (auVar16._0_4_ + auVar153._0_4_) * fVar76;
            fVar131 = (auVar16._4_4_ + auVar153._4_4_) * fVar76;
            auVar17._4_4_ = fVar131;
            auVar17._0_4_ = fVar128;
            fVar132 = (auVar16._8_4_ + auVar153._8_4_) * fVar76;
            auVar17._8_4_ = fVar132;
            fVar133 = (auVar16._12_4_ + auVar153._12_4_) * fVar76;
            auVar17._12_4_ = fVar133;
            fVar134 = (auVar16._16_4_ + auVar153._16_4_) * fVar76;
            auVar17._16_4_ = fVar134;
            fVar135 = (auVar16._20_4_ + auVar153._20_4_) * fVar76;
            auVar17._20_4_ = fVar135;
            fVar136 = (auVar16._24_4_ + auVar153._24_4_) * fVar76;
            auVar17._24_4_ = fVar136;
            auVar17._28_4_ = fVar78;
            fVar137 = (auVar155._0_4_ + auVar147._0_4_) * fVar76;
            fVar140 = (auVar155._4_4_ + auVar147._4_4_) * fVar76;
            auVar16._4_4_ = fVar140;
            auVar16._0_4_ = fVar137;
            fVar141 = (auVar155._8_4_ + auVar147._8_4_) * fVar76;
            auVar16._8_4_ = fVar141;
            fVar142 = (auVar155._12_4_ + auVar147._12_4_) * fVar76;
            auVar16._12_4_ = fVar142;
            fVar143 = (auVar155._16_4_ + auVar147._16_4_) * fVar76;
            auVar16._16_4_ = fVar143;
            fVar144 = (auVar155._20_4_ + auVar147._20_4_) * fVar76;
            auVar16._20_4_ = fVar144;
            fVar145 = (auVar155._24_4_ + auVar147._24_4_) * fVar76;
            auVar16._24_4_ = fVar145;
            auVar16._28_4_ = fVar146;
            fVar117 = fVar76 * (auVar103._0_4_ + auVar111._0_4_);
            fVar121 = fVar76 * (auVar103._4_4_ + auVar111._4_4_);
            auVar155._4_4_ = fVar121;
            auVar155._0_4_ = fVar117;
            fVar122 = fVar76 * (auVar103._8_4_ + auVar111._8_4_);
            auVar155._8_4_ = fVar122;
            fVar123 = fVar76 * (auVar103._12_4_ + auVar111._12_4_);
            auVar155._12_4_ = fVar123;
            fVar124 = fVar76 * (auVar103._16_4_ + auVar111._16_4_);
            auVar155._16_4_ = fVar124;
            fVar125 = fVar76 * (auVar103._20_4_ + auVar111._20_4_);
            auVar155._20_4_ = fVar125;
            fVar126 = fVar76 * (auVar103._24_4_ + auVar111._24_4_);
            auVar155._24_4_ = fVar126;
            auVar155._28_4_ = fVar127;
            auVar148._0_4_ = (int)fVar117;
            auVar148._4_4_ = (int)fVar121;
            auVar148._8_4_ = (int)fVar122;
            auVar148._12_4_ = (int)fVar123;
            auVar148._16_4_ = (int)fVar124;
            auVar148._20_4_ = (int)fVar125;
            auVar148._24_4_ = (int)fVar126;
            auVar148._28_4_ = (int)fVar127;
            auVar147 = vpsrad_avx2(auVar148,0x1f);
            auVar103 = vsubps_avx(auVar155,auVar158);
            auVar120._0_4_ = (int)auVar103._0_4_;
            auVar120._4_4_ = (int)auVar103._4_4_;
            auVar120._8_4_ = (int)auVar103._8_4_;
            auVar120._12_4_ = (int)auVar103._12_4_;
            auVar120._16_4_ = (int)auVar103._16_4_;
            auVar120._20_4_ = (int)auVar103._20_4_;
            auVar120._24_4_ = (int)auVar103._24_4_;
            auVar120._28_4_ = (int)auVar103._28_4_;
            auVar103 = vpand_avx2(auVar147,auVar120);
            auVar153 = vpor_avx2(auVar148,auVar103);
            auVar149._0_4_ = (int)fVar137;
            auVar149._4_4_ = (int)fVar140;
            auVar149._8_4_ = (int)fVar141;
            auVar149._12_4_ = (int)fVar142;
            auVar149._16_4_ = (int)fVar143;
            auVar149._20_4_ = (int)fVar144;
            auVar149._24_4_ = (int)fVar145;
            auVar149._28_4_ = (int)fVar146;
            auVar147 = vpsrad_avx2(auVar149,0x1f);
            auVar103 = vsubps_avx(auVar16,auVar158);
            auVar138._0_4_ = (int)auVar103._0_4_;
            auVar138._4_4_ = (int)auVar103._4_4_;
            auVar138._8_4_ = (int)auVar103._8_4_;
            auVar138._12_4_ = (int)auVar103._12_4_;
            auVar138._16_4_ = (int)auVar103._16_4_;
            auVar138._20_4_ = (int)auVar103._20_4_;
            auVar138._24_4_ = (int)auVar103._24_4_;
            auVar138._28_4_ = (int)auVar103._28_4_;
            auVar103 = vpand_avx2(auVar138,auVar147);
            auVar154 = vpor_avx2(auVar149,auVar103);
            auVar139 = ZEXT3264(auVar154);
            auVar150._0_4_ = (int)fVar128;
            auVar150._4_4_ = (int)fVar131;
            auVar150._8_4_ = (int)fVar132;
            auVar150._12_4_ = (int)fVar133;
            auVar150._16_4_ = (int)fVar134;
            auVar150._20_4_ = (int)fVar135;
            auVar150._24_4_ = (int)fVar136;
            auVar150._28_4_ = (int)fVar78;
            auVar147 = vpsrad_avx2(auVar150,0x1f);
            auVar103 = vsubps_avx(auVar17,auVar158);
            auVar130._0_4_ = (int)auVar103._0_4_;
            auVar130._4_4_ = (int)auVar103._4_4_;
            auVar130._8_4_ = (int)auVar103._8_4_;
            auVar130._12_4_ = (int)auVar103._12_4_;
            auVar130._16_4_ = (int)auVar103._16_4_;
            auVar130._20_4_ = (int)auVar103._20_4_;
            auVar130._24_4_ = (int)auVar103._24_4_;
            auVar130._28_4_ = (int)auVar103._28_4_;
            auVar103 = vpand_avx2(auVar147,auVar130);
            auVar147 = vpor_avx2(auVar150,auVar103);
            auVar151._0_4_ = (int)fVar92;
            auVar151._4_4_ = (int)fVar113;
            auVar151._8_4_ = (int)fVar94;
            auVar151._12_4_ = (int)fVar93;
            auVar151._16_4_ = (int)fVar108;
            auVar151._20_4_ = (int)fVar114;
            auVar151._24_4_ = (int)fVar115;
            auVar151._28_4_ = (int)fVar116;
            auVar155 = vpsrad_avx2(auVar151,0x1f);
            auVar103 = vsubps_avx(auVar19,auVar158);
            auVar111._0_4_ = (int)auVar103._0_4_;
            auVar111._4_4_ = (int)auVar103._4_4_;
            auVar111._8_4_ = (int)auVar103._8_4_;
            auVar111._12_4_ = (int)auVar103._12_4_;
            auVar111._16_4_ = (int)auVar103._16_4_;
            auVar111._20_4_ = (int)auVar103._20_4_;
            auVar111._24_4_ = (int)auVar103._24_4_;
            auVar111._28_4_ = (int)auVar103._28_4_;
            auVar103 = vpand_avx2(auVar155,auVar111);
            auVar156._8_4_ = 0xff;
            auVar156._0_8_ = 0xff000000ff;
            auVar156._12_4_ = 0xff;
            auVar156._16_4_ = 0xff;
            auVar156._20_4_ = 0xff;
            auVar156._24_4_ = 0xff;
            auVar156._28_4_ = 0xff;
            auVar103 = vpor_avx2(auVar151,auVar103);
            auVar103 = vpminud_avx2(auVar103,auVar156);
            auVar147 = vpminud_avx2(auVar147,auVar156);
            auVar103 = vpackusdw_avx2(auVar103,auVar147);
            auVar147 = vpminud_avx2(auVar154,auVar156);
            auVar153 = vpminud_avx2(auVar153,auVar156);
            auVar147 = vpackusdw_avx2(auVar147,auVar153);
            auVar147 = vpermq_avx2(auVar147,0xd8);
            auVar103 = vpermq_avx2(auVar103,0xd8);
            auVar103 = vpackuswb_avx2(auVar147,auVar103);
            auVar103 = vpermq_avx2(auVar103,0xd8);
            *(undefined1 (*) [32])((long)&asStack_238[0].data + lVar53) = auVar103;
            lVar53 = lVar53 + 0x20;
            auVar112._8_4_ = 0x20;
            auVar112._0_8_ = 0x2000000020;
            auVar112._12_4_ = 0x20;
            auVar112._16_4_ = 0x20;
            auVar112._20_4_ = 0x20;
            auVar112._24_4_ = 0x20;
            auVar112._28_4_ = 0x20;
            auVar102 = vpaddd_avx2(auVar102,auVar112);
            auVar18 = vpaddd_avx2(auVar18,auVar112);
            auVar107 = vpaddd_avx2(auVar107,auVar112);
            auVar119 = vpaddd_avx2(auVar119,auVar112);
          } while (lVar53 != 0x100);
          iVar55 = psVar62[1].cff.cursor;
          if (0 < iVar55) {
            lVar60._0_4_ = psVar62[1].hmtx;
            lVar60._4_4_ = psVar62[1].kern;
            iVar37 = 0;
            do {
              if ((*(int *)(lVar60 + 0xc) != 0) && (*(ushort *)(lVar60 + 6) != 0)) {
                iVar55 = atlas->TexWidth;
                uVar27 = *(ushort *)(lVar60 + 4);
                puVar43 = atlas->TexPixelsAlpha8 +
                          (ulong)*(ushort *)(lVar60 + 10) * (long)iVar55 +
                          (ulong)*(ushort *)(lVar60 + 8);
                uVar34 = (uint)*(ushort *)(lVar60 + 6);
                do {
                  if ((ulong)uVar27 != 0) {
                    uVar39 = 0;
                    do {
                      puVar43[uVar39] =
                           *(uchar *)((long)&asStack_238[0].data + (ulong)puVar43[uVar39]);
                      uVar39 = uVar39 + 1;
                    } while (uVar27 != uVar39);
                  }
                  puVar43 = puVar43 + iVar55;
                  bVar26 = 1 < (int)uVar34;
                  uVar34 = uVar34 - 1;
                } while (bVar26);
                iVar55 = psVar62[1].cff.cursor;
              }
              iVar37 = iVar37 + 1;
              lVar60 = lVar60 + 0x10;
            } while (iVar37 < iVar55);
          }
        }
        psVar62[1].hmtx = 0;
        psVar62[1].kern = 0;
        lVar53 = lStack_330;
      }
      lVar53 = lVar53 + 1;
    } while (lVar53 != CONCAT44(iVar161,uVar160));
  }
  ImGui::MemFree(psStack_488);
  ImGui::MemFree(psStack_338);
  pvVar40 = pvStack_3e0;
  if (pvStack_3e0 != (void *)0x0) {
    auVar24._8_8_ = 0;
    auVar24._0_8_ = pvStack_3e0;
    _auStack_3e8 = (stbtt__buf)(auVar24 << 0x40);
    ImGui::MemFree(pvVar40);
    pvStack_3e0._0_4_ = 0;
    pvStack_3e0._4_4_ = 0;
  }
  if (0 < (int)uVar160) {
    lVar53 = 0;
    uStack_498._0_2_ = 1;
    uStack_498._2_2_ = 1;
    uStack_494 = 1;
    uStack_492 = 1;
    uStack_490 = 1;
    uStack_48e = 1;
    uStack_48c = 1;
    uStack_48a = 1;
    do {
      lVar74 = lVar53 * 0x110;
      iVar55 = *(int *)((long)pvStack_4d0 + lVar74 + 0xe8);
      if (iVar55 != 0) {
        if ((pIStack_480->ConfigData).Size <= lVar53) goto LAB_0018e7bd;
        pIVar14 = (pIStack_480->ConfigData).Data;
        pIVar71 = pIVar14 + lVar53;
        pIVar11 = pIVar14[lVar53].DstFont;
        if (pIVar14[lVar53].MergeMode == true) {
          uVar10 = pIVar11->ConfigDataCount;
          sVar48 = uVar10 + 1;
          fVar76 = pIVar11->Ascent;
        }
        else {
          fVar76 = pIVar14[lVar53].SizePixels;
          lVar60 = *(long *)((long)pvStack_4d0 + lVar74 + 8);
          lVar58 = (long)*(int *)((long)pvStack_4d0 + lVar74 + 0x24);
          auVar80 = vpinsrb_avx(ZEXT116(*(byte *)(lVar60 + 4 + lVar58)),
                                (uint)*(byte *)(lVar60 + 6 + lVar58),1);
          uVar59 = auVar80._8_8_;
          auStack_478 = vpinsrb_avx(ZEXT116(*(byte *)(lVar60 + 5 + lVar58)),
                                    (uint)*(byte *)(lVar60 + 7 + lVar58),1);
          ImFont::ClearOutputData(pIVar11);
          auVar20._8_8_ = uVar59;
          auVar20._0_8_ = auVar80._0_8_;
          auVar79 = vpunpcklbw_avx(auStack_478,auVar20);
          uVar38 = vpextrw_avx(auVar79,1);
          fVar76 = fVar76 / (float)((int)auVar79._0_2_ - (int)(short)uVar38);
          auVar80 = vpmovsxwd_avx(auVar79);
          auVar95 = vcvtdq2ps_avx(auVar80);
          auVar21._2_2_ = uStack_498._2_2_;
          auVar21._0_2_ = (undefined2)uStack_498;
          auVar21._4_2_ = uStack_494;
          auVar21._6_2_ = uStack_492;
          auVar21._8_2_ = uStack_490;
          auVar21._10_2_ = uStack_48e;
          auVar21._12_2_ = uStack_48c;
          auVar21._14_2_ = uStack_48a;
          auVar80 = vpcmpgtw_avx(auVar21,auVar79);
          auVar80 = vpmovsxwd_avx(auVar80);
          auVar101._8_4_ = 0x3f800000;
          auVar101._0_8_ = 0x3f8000003f800000;
          auVar101._12_4_ = 0x3f800000;
          auVar106._8_4_ = 0xbf800000;
          auVar106._0_8_ = 0xbf800000bf800000;
          auVar106._12_4_ = 0xbf800000;
          auVar80 = vblendvps_avx(auVar101,auVar106,auVar80);
          auVar87._0_4_ = (int)(auVar95._0_4_ * fVar76 + auVar80._0_4_);
          auVar87._4_4_ = (int)(auVar95._4_4_ * fVar76 + auVar80._4_4_);
          auVar87._8_4_ = (int)(auVar95._8_4_ * fVar76 + auVar80._8_4_);
          auVar87._12_4_ = (int)(auVar95._12_4_ * fVar76 + auVar80._12_4_);
          auVar80 = vcvtdq2ps_avx(auVar87);
          fVar76 = auVar80._0_4_;
          pIVar11->FontSize = pIVar71->SizePixels;
          pIVar11->ConfigData = pIVar71;
          pIVar11->ContainerAtlas = pIStack_480;
          uVar59 = vmovlps_avx(auVar80);
          pIVar11->Ascent = (float)(int)uVar59;
          pIVar11->Descent = (float)(int)((ulong)uVar59 >> 0x20);
          iVar55 = *(int *)((long)pvStack_4d0 + lVar74 + 0xe8);
          sVar48 = 1;
        }
        pIVar11->ConfigDataCount = sVar48;
        if (0 < iVar55) {
          fVar78 = (pIVar71->GlyphOffset).x;
          auVar80 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar76 + 0.5)));
          fVar76 = auVar80._0_4_ + (pIVar71->GlyphOffset).y;
          lVar58 = 0;
          lVar60 = 0;
          do {
            if (*(int *)((long)pvStack_4d0 + lVar74 + 0x100) <= lVar60) goto LAB_0018e700;
            lVar15 = *(long *)((long)pvStack_4d0 + lVar74 + 0xd0);
            fVar92 = 1.0 / (float)pIStack_480->TexWidth;
            fVar113 = 1.0 / (float)pIStack_480->TexHeight;
            ImFont::AddGlyph(pIVar11,pIVar71,
                             *(ImWchar *)
                              (*(long *)((long)pvStack_4d0 + lVar74 + 0x108) + lVar60 * 4),
                             fVar78 + *(float *)(lVar15 + 8 + lVar58) + 0.0,
                             fVar76 + *(float *)(lVar15 + 0xc + lVar58) + 0.0,
                             fVar78 + *(float *)(lVar15 + 0x14 + lVar58) + 0.0,
                             fVar76 + *(float *)(lVar15 + 0x18 + lVar58) + 0.0,
                             fVar92 * (float)*(ushort *)(lVar15 + lVar58),
                             fVar113 * (float)*(ushort *)(lVar15 + 2 + lVar58),
                             fVar92 * (float)*(ushort *)(lVar15 + 4 + lVar58),
                             fVar113 * (float)*(ushort *)(lVar15 + 6 + lVar58),
                             *(float *)(lVar15 + 0x10 + lVar58));
            lVar60 = lVar60 + 1;
            lVar58 = lVar58 + 0x1c;
          } while (lVar60 < *(int *)((long)pvStack_4d0 + lVar74 + 0xe8));
        }
      }
      atlas = pIStack_480;
      lVar53 = lVar53 + 1;
    } while (lVar53 != CONCAT44(iVar161,uVar160));
    if (0 < (int)uVar160) {
      sVar56 = 0;
      do {
        pvVar40 = *(void **)((long)pvStack_4d0 + sVar56 + 0x108);
        if (pvVar40 != (void *)0x0) {
          ImGui::MemFree(pvVar40);
        }
        pvVar40 = *(void **)((long)pvStack_4d0 + sVar56 + 0xf8);
        if (pvVar40 != (void *)0x0) {
          ImGui::MemFree(pvVar40);
        }
        sVar56 = sVar56 + 0x110;
      } while (sStack_2e8 != sVar56);
    }
  }
  ImFontAtlasBuildFinish(atlas);
  if (pvStack_3a0 != (void *)0x0) {
    ImGui::MemFree(pvStack_3a0);
  }
  bVar26 = true;
LAB_0018e680:
  if (pvStack_4d0 != (void *)0x0) {
    ImGui::MemFree(pvStack_4d0);
  }
  return bVar26;
LAB_0018e853:
  __function = "T &ImVector<ImFontBuildDstData>::operator[](int) [T = ImFontBuildDstData]";
  goto LAB_0018e715;
LAB_0018e7bd:
  __function = "T &ImVector<ImFontConfig>::operator[](int) [T = ImFontConfig]";
  goto LAB_0018e715;
LAB_0018e700:
  __function = "T &ImVector<int>::operator[](int) [T = int]";
LAB_0018e715:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x66a,__function);
}

Assistant:

bool    ImFontAtlas::Build()
{
    IM_ASSERT(!Locked && "Cannot modify a locked ImFontAtlas between NewFrame() and EndFrame/Render()!");

    // Select builder
    // - Note that we do not reassign to atlas->FontBuilderIO, since it is likely to point to static data which
    //   may mess with some hot-reloading schemes. If you need to assign to this (for dynamic selection) AND are
    //   using a hot-reloading scheme that messes up static data, store your own instance of ImFontBuilderIO somewhere
    //   and point to it instead of pointing directly to return value of the GetBuilderXXX functions.
    const ImFontBuilderIO* builder_io = FontBuilderIO;
    if (builder_io == NULL)
    {
#ifdef IMGUI_ENABLE_FREETYPE
        builder_io = ImGuiFreeType::GetBuilderForFreeType();
#elif defined(IMGUI_ENABLE_STB_TRUETYPE)
        builder_io = ImFontAtlasGetBuilderForStbTruetype();
#else
        IM_ASSERT(0); // Invalid Build function
#endif
    }

    // Build
    return builder_io->FontBuilder_Build(this);
}